

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O3

MPP_RET init_picture(H264_SLICE_t *currSlice)

{
  RK_S32 *pRVar1;
  RK_U32 *pRVar2;
  RK_U8 *list_size;
  RK_U8 *list_size_00;
  undefined4 uVar3;
  undefined4 uVar4;
  RK_U8 RVar5;
  MppFrameFormat MVar6;
  H264dVideoCtx_t *p_Vid;
  h264_dec_ctx_t *phVar7;
  h264_sps_t *phVar8;
  h264_dpb_buf_t *phVar9;
  h264_sps_t *phVar10;
  H264dVideoCtx_t *pHVar11;
  h264_dpb_buf_t *phVar12;
  h264_dpb_mark_t *phVar13;
  H264_FrameStore_t *pHVar14;
  H264_DecCtx_t *pHVar15;
  h264_dec_ctx_t *phVar16;
  MppFrame pvVar17;
  undefined8 uVar18;
  h264_sei_t *phVar19;
  undefined8 uVar20;
  h264d_cur_ctx_t *phVar21;
  h264d_video_ctx_t *phVar22;
  h264_store_pic_t **pphVar23;
  h264d_dxva_ctx_t *phVar24;
  RK_S64 RVar25;
  undefined1 auVar26 [16];
  h264_dpb_info_t *phVar27;
  ushort uVar28;
  ushort uVar29;
  RK_U32 RVar30;
  RK_S32 RVar31;
  RK_U32 RVar32;
  MPP_RET MVar33;
  h264_store_pic_t *phVar34;
  H264_StorePic_t *p;
  H264_FrameStore_t **ppHVar35;
  H264_FrameStore_t **ppHVar36;
  H264_FrameStore_t **fs_list;
  MppBuffer buffer;
  h264_frame_store_t **pphVar37;
  h264_frame_store_t **pphVar38;
  uint uVar39;
  RK_U32 RVar40;
  undefined4 uVar41;
  long lVar42;
  h264_store_pic_t *phVar43;
  ulong uVar44;
  h264_refpic_info_t *phVar45;
  HalDecTask *pHVar46;
  int iVar47;
  int iVar48;
  ulong uVar49;
  char *pcVar50;
  MppFrameFormat MVar51;
  int iVar52;
  int iVar53;
  h264_dpb_info_t *phVar54;
  MppFrameFormat MVar55;
  uint uVar56;
  uint uVar57;
  int iVar58;
  RK_S32 RVar59;
  ulong uVar60;
  long lVar61;
  RK_S32 RVar62;
  MppFrame s;
  long lVar63;
  RK_S32 *pRVar64;
  byte bVar65;
  uint uVar66;
  undefined8 uVar67;
  RK_S32 *pRVar68;
  RK_S32 currPOC;
  RK_S32 *pRVar69;
  h264_frame_store_t *phVar70;
  ulong uVar71;
  bool bVar72;
  H264_DecCtx_t *p_Dec;
  h264_store_pic_t *phVar73;
  h264_dpb_mark_t *phVar74;
  size_t sVar75;
  RK_S32 RVar76;
  bool bVar77;
  undefined8 uVar78;
  RK_U8 *local_d0;
  RK_S32 *local_c0;
  RK_S32 *local_a8;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  p_Vid = currSlice->p_Vid;
  phVar7 = p_Vid->p_Dec;
  RVar30 = (phVar7->errctx).i_slice_no;
  if ((((RVar30 == 0) && ((p_Vid->recovery).valid_flag != 0)) &&
      ((p_Vid->recovery).first_frm_valid != 0)) &&
     ((p_Vid->recovery).first_frm_id == currSlice->frame_num)) {
    uVar39 = (uint)(currSlice->layer_id == 0);
  }
  else {
    uVar39 = 0;
    if (currSlice->layer_id == 0) {
      uVar39 = (uint)(currSlice->slice_type == 2);
    }
    uVar39 = uVar39 + RVar30;
  }
  (phVar7->errctx).i_slice_no = uVar39;
  if (uVar39 == 0) {
    if ((h264d_debug & 4) == 0) {
      return MPP_NOK;
    }
    _mpp_log_l(4,"h264d_init","[Discard] Discard slice before I Slice. \n",(char *)0x0);
    return MPP_NOK;
  }
  phVar8 = p_Vid->active_sps;
  phVar9 = currSlice->p_Dpb;
  phVar34 = alloc_storable_picture(p_Vid,currSlice->structure);
  if (phVar34 == (H264_StorePic_t *)0x0) {
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x28a);
    }
    MVar33 = MPP_ERR_MALLOC;
  }
  else {
    iVar48 = currSlice->layer_id;
    RVar76 = p_Vid->last_toppoc[iVar48];
    local_c0 = &currSlice->toppoc;
    currSlice->toppoc = RVar76;
    RVar62 = p_Vid->last_bottompoc[iVar48];
    pRVar64 = &currSlice->bottompoc;
    currSlice->bottompoc = RVar62;
    currSlice->framepoc = p_Vid->last_framepoc[iVar48];
    currSlice->ThisPOC = p_Vid->last_thispoc[iVar48];
    phVar10 = p_Vid->active_sps;
    uVar39 = 1 << ((char)phVar10->log2_max_pic_order_cnt_lsb_minus4 + 4U & 0x1f);
    pRVar68 = &currSlice->framepoc;
    pRVar1 = &currSlice->ThisPOC;
    iVar53 = phVar10->pic_order_cnt_type;
    if (iVar53 == 2) {
      if (currSlice->idr_flag == 0) {
        if (p_Vid->last_has_mmco_5 == 0) {
          RVar32 = p_Vid->PreviousFrameNum;
          RVar30 = p_Vid->PreviousFrameNumOffset;
        }
        else {
          RVar30 = 0;
          p_Vid->PreviousFrameNum = 0;
          p_Vid->PreviousFrameNumOffset = 0;
          RVar32 = 0;
        }
        RVar40 = currSlice->frame_num;
        if ((int)RVar40 < (int)RVar32) {
          RVar30 = RVar30 + p_Vid->max_frame_num;
        }
        p_Vid->FrameNumOffset = RVar30;
        currSlice->AbsFrameNum = RVar30 + RVar40;
        iVar53 = (RVar30 + RVar40) * 2 - (uint)(currSlice->nal_reference_idc == 0);
        currSlice->ThisPOC = iVar53;
        RVar31 = iVar53;
        if (currSlice->field_pic_flag == 0) {
          *pRVar68 = iVar53;
          *pRVar64 = iVar53;
          *local_c0 = iVar53;
          RVar62 = iVar53;
        }
        else {
          currSlice->framepoc = iVar53;
          if (currSlice->bottom_field_flag == 0) {
            *local_c0 = iVar53;
          }
          else {
            *pRVar64 = iVar53;
            RVar62 = iVar53;
            RVar31 = RVar76;
          }
        }
      }
      else {
        p_Vid->FrameNumOffset = 0;
        currSlice->ThisPOC = 0;
        currSlice->toppoc = 0;
        currSlice->bottompoc = 0;
        currSlice->framepoc = 0;
        if (currSlice->frame_num != 0) {
          uVar67 = 0xa1;
LAB_00196e8b:
          MVar33 = MPP_ERR_VALUE;
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,uVar67);
            MVar33 = MPP_ERR_VALUE;
          }
          goto LAB_00196eb8;
        }
        iVar53 = 0;
        RVar30 = 0;
        RVar40 = 0;
        RVar62 = 0;
        RVar31 = 0;
      }
LAB_001972e3:
      p_Vid->PreviousFrameNum = RVar40;
      lVar42 = 0xcc8;
LAB_001972ee:
      *(RK_U32 *)((long)p_Vid->spsSet + lVar42) = RVar30;
LAB_001972f2:
      phVar34->top_poc = RVar31;
      phVar34->bottom_poc = RVar62;
      phVar34->frame_poc = iVar53;
      phVar34->ThisPOC = iVar53;
      p_Vid->last_toppoc[iVar48] = RVar31;
      p_Vid->last_bottompoc[currSlice->layer_id] = currSlice->bottompoc;
      p_Vid->last_framepoc[currSlice->layer_id] = currSlice->framepoc;
      p_Vid->last_thispoc[currSlice->layer_id] = currSlice->ThisPOC;
      iVar48 = currSlice->structure;
      if (iVar48 == 3) {
        if (currSlice->mb_aff_frame_flag == 0) {
          phVar34->iCodingType = 0;
        }
        else {
          phVar34->iCodingType = 3;
        }
      }
      else {
        phVar34->iCodingType = 1;
      }
      iVar53 = currSlice->layer_id;
      phVar34->layer_id = iVar53;
      phVar34->view_id = currSlice->view_id;
      uVar3 = currSlice->anchor_pic_flag;
      uVar4 = currSlice->inter_view_flag;
      phVar34->inter_view_flag = uVar4;
      phVar34->anchor_pic_flag = uVar3;
      if ((iVar53 == 1) && ((p_Vid->profile_idc == 0x80 || (p_Vid->profile_idc == 0x76)))) {
        pHVar11 = currSlice->p_Vid;
        phVar12 = pHVar11->p_Dpb_layer[0];
        uVar44 = (ulong)phVar12->used_size;
        if (iVar48 == 3) {
          if (uVar44 != 0) {
            uVar60 = 0;
            phVar43 = (h264_store_pic_t *)0x0;
            do {
              phVar73 = phVar12->fs[uVar60]->frame;
              if ((phVar73 != (h264_store_pic_t *)0x0) && (phVar73->layer_id == 0)) {
                bVar77 = phVar73->is_mmco_5 == '\0';
                pRVar69 = &phVar73->poc;
                if (!bVar77) {
                  pRVar69 = &phVar73->poc_mmco5;
                }
                if (*pRVar69 == *pRVar68) {
                  phVar43 = phVar73;
                }
                if (bVar77 && *pRVar69 == *pRVar68) goto LAB_00197539;
              }
              uVar60 = uVar60 + 1;
            } while (uVar44 != uVar60);
            goto LAB_0019752d;
          }
        }
        else if (iVar48 == 1) {
          if (uVar44 != 0) {
            uVar60 = 0;
            phVar43 = (h264_store_pic_t *)0x0;
            do {
              phVar73 = phVar12->fs[uVar60]->top_field;
              if ((phVar73 != (h264_store_pic_t *)0x0) && (phVar73->layer_id == 0)) {
                bVar77 = phVar73->is_mmco_5 == '\0';
                pRVar69 = &phVar73->top_poc;
                if (!bVar77) {
                  pRVar69 = &phVar73->top_poc_mmco5;
                }
                if (*pRVar69 == *local_c0) {
                  phVar43 = phVar73;
                }
                if (bVar77 && *pRVar69 == *local_c0) goto LAB_00197539;
              }
              uVar60 = uVar60 + 1;
            } while (uVar44 != uVar60);
LAB_0019752d:
            phVar73 = phVar43;
            if (phVar43 != (h264_store_pic_t *)0x0) {
LAB_00197539:
              p = alloc_storable_picture(pHVar11,pHVar11->structure);
              if (p == (H264_StorePic_t *)0x0) {
                MVar33 = MPP_ERR_MALLOC;
                if (((h264d_debug & 1) != 0) &&
                   (_mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x104),
                   (h264d_debug & 1) != 0)) {
                  _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x174);
                }
              }
              else {
                p->mem_malloc_type = Mem_Clone;
                phVar13 = phVar73->mem_mark;
                p->mem_mark = phVar13;
                uVar39 = p->structure;
                if ((uVar39 & 0xfffffffd) == 1) {
                  phVar13->top_used = phVar13->top_used + '\x01';
                }
                if ((uVar39 & 0xfffffffe) == 2) {
                  phVar13->bot_used = phVar13->bot_used + '\x01';
                }
                p->colmv_no_used_flag = '\x01';
                RVar76 = phVar73->pic_num;
                RVar30 = phVar73->frame_num;
                RVar62 = phVar73->long_term_frame_idx;
                p->long_term_pic_num = phVar73->long_term_pic_num;
                p->long_term_frame_idx = RVar62;
                p->is_long_term = '\0';
                p->non_existing = phVar73->non_existing;
                p->max_slice_id = phVar73->max_slice_id;
                p->mb_aff_frame_flag = phVar73->mb_aff_frame_flag;
                iVar53 = phVar73->structure;
                RVar62 = phVar73->poc;
                RVar31 = phVar73->top_poc;
                RVar59 = phVar73->bottom_poc;
                p->structure = iVar53;
                p->poc = RVar62;
                p->top_poc = RVar31;
                p->bottom_poc = RVar59;
                p->frame_poc = phVar73->frame_poc;
                p->is_mmco_5 = phVar73->is_mmco_5;
                RVar62 = phVar73->top_poc_mmco5;
                p->poc_mmco5 = phVar73->poc_mmco5;
                p->top_poc_mmco5 = RVar62;
                p->bot_poc_mmco5 = phVar73->bot_poc_mmco5;
                p->pic_num = RVar76;
                p->frame_num = RVar30;
                RVar76 = phVar73->idr_flag;
                p->slice_type = phVar73->slice_type;
                p->idr_flag = RVar76;
                p->no_output_of_prior_pics_flag = phVar73->no_output_of_prior_pics_flag;
                p->long_term_reference_flag = 0;
                p->adaptive_ref_pic_buffering_flag = 0;
                p->dec_ref_pic_marking_buffer = (h264_drpm_t *)0x0;
                p->PicWidthInMbs = phVar73->PicWidthInMbs;
                RVar76 = phVar73->frame_mbs_only_flag;
                p->chroma_format_idc = phVar73->chroma_format_idc;
                p->frame_mbs_only_flag = RVar76;
                iVar48 = phVar73->frame_cropping_flag;
                p->frame_cropping_flag = iVar48;
                if (iVar48 != 0) {
                  RVar76 = phVar73->frame_crop_right_offset;
                  RVar62 = phVar73->frame_crop_top_offset;
                  RVar31 = phVar73->frame_crop_bottom_offset;
                  p->frame_crop_left_offset = phVar73->frame_crop_left_offset;
                  p->frame_crop_right_offset = RVar76;
                  p->frame_crop_top_offset = RVar62;
                  p->frame_crop_bottom_offset = RVar31;
                }
                p->anchor_pic_flag = 0;
                RVar76 = phVar73->inter_view_flag;
                p->view_id = phVar73->view_id;
                p->inter_view_flag = RVar76;
                p->layer_id = phVar73->layer_id;
                p->proc_flag = 1;
                p->used_for_reference = 1;
                p->is_output = 1;
                phVar12 = currSlice->p_Dpb;
                pHVar11 = phVar12->p_Vid;
                pHVar14 = *phVar12->fs_ilref;
                if (phVar12->used_size_il == 0) {
                  if (pHVar14->is_used < 1) goto LAB_00197732;
                  if (iVar53 != 1) {
                    if (iVar53 == 2) {
                      if (pHVar14->bottom_field != (h264_store_pic_t *)0x0) {
                        MVar33 = MPP_ERR_VALUE;
                        if ((h264d_debug & 4) != 0) {
                          pcVar50 = "value error(%d).\n";
                          uVar67 = 0xe6;
                          goto LAB_00197855;
                        }
                        goto LAB_0019785c;
                      }
                      goto LAB_00197732;
                    }
                    if ((iVar53 != 3) || (pHVar14->frame == (h264_store_pic_t *)0x0))
                    goto LAB_00197732;
                    MVar33 = MPP_ERR_VALUE;
                    if ((h264d_debug & 4) == 0) goto LAB_0019785c;
                    pcVar50 = "value error(%d).\n";
                    uVar67 = 0xe2;
                    goto LAB_00197855;
                  }
                  if (pHVar14->top_field == (h264_store_pic_t *)0x0) goto LAB_00197732;
                  MVar33 = MPP_ERR_VALUE;
                  if ((h264d_debug & 4) != 0) {
                    pcVar50 = "value error(%d).\n";
                    uVar67 = 0xe4;
                    goto LAB_00197855;
                  }
                }
                else {
                  pHVar15 = pHVar11->p_Dec;
                  if (pHVar14->frame != (H264_StorePic_t *)0x0) {
                    free_storable_picture(pHVar15,pHVar14->frame);
                    pHVar14->frame = (h264_store_pic_t *)0x0;
                  }
                  if (pHVar14->top_field != (H264_StorePic_t *)0x0) {
                    free_storable_picture(pHVar15,pHVar14->top_field);
                    pHVar14->top_field = (h264_store_pic_t *)0x0;
                  }
                  if (pHVar14->bottom_field != (H264_StorePic_t *)0x0) {
                    free_storable_picture(pHVar15,pHVar14->bottom_field);
                    pHVar14->bottom_field = (h264_store_pic_t *)0x0;
                  }
                  pHVar14->is_used = 0;
                  pHVar14->is_reference = 0;
                  phVar12->used_size_il = phVar12->used_size_il - 1;
LAB_00197732:
                  MVar33 = insert_picture_in_dpb(pHVar11,pHVar14,p,'\0');
                  if (MPP_NOK < MVar33) {
                    iVar48 = pHVar14->is_used;
                    if (p->structure == 3) {
                      bVar77 = iVar48 == 3;
                    }
                    else {
                      bVar77 = iVar48 < 3 && iVar48 != 0;
                    }
                    if (bVar77) {
                      phVar12->used_size_il = phVar12->used_size_il + 1;
                    }
                    goto LAB_001978e1;
                  }
                  if ((h264d_debug & 4) != 0) {
                    pcVar50 = "Function error(%d).\n";
                    uVar67 = 0xe9;
LAB_00197855:
                    _mpp_log_l(4,"h264d_init",pcVar50,(char *)0x0,uVar67);
                  }
                }
LAB_0019785c:
                if ((h264d_debug & 4) != 0) {
                  _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x175);
                }
              }
              if ((h264d_debug & 4) == 0) goto LAB_0019821d;
              uVar67 = 0x2aa;
              goto LAB_00196ee3;
            }
          }
        }
        else if (uVar44 != 0) {
          uVar60 = 0;
          phVar43 = (h264_store_pic_t *)0x0;
          do {
            phVar73 = phVar12->fs[uVar60]->bottom_field;
            if ((phVar73 != (h264_store_pic_t *)0x0) && (phVar73->layer_id == 0)) {
              bVar77 = phVar73->is_mmco_5 == '\0';
              pRVar69 = &phVar73->bottom_poc;
              if (!bVar77) {
                pRVar69 = &phVar73->bot_poc_mmco5;
              }
              if (*pRVar69 == *pRVar64) {
                phVar43 = phVar73;
              }
              if (bVar77 && *pRVar69 == *pRVar64) goto LAB_00197539;
            }
            uVar60 = uVar60 + 1;
          } while (uVar44 != uVar60);
          goto LAB_0019752d;
        }
      }
LAB_001978e1:
      iVar48 = currSlice->structure;
      MVar33 = MPP_NOK;
      if (((iVar48 == 1) || (local_c0 = pRVar68, iVar48 == 3)) || (local_c0 = pRVar64, iVar48 == 2))
      {
        phVar34->poc = *local_c0;
        phVar34->slice_type = p_Vid->type;
        phVar34->used_for_reference = (uint)(currSlice->nal_reference_idc != 0);
        phVar34->idr_flag = currSlice->idr_flag;
        RVar76 = currSlice->long_term_reference_flag;
        phVar34->no_output_of_prior_pics_flag = currSlice->no_output_of_prior_pics_flag;
        phVar34->long_term_reference_flag = RVar76;
        phVar34->adaptive_ref_pic_buffering_flag = currSlice->adaptive_ref_pic_buffering_flag;
        phVar34->dec_ref_pic_marking_buffer = currSlice->dec_ref_pic_marking_buffer;
        currSlice->dec_ref_pic_marking_buffer = (h264_drpm_t *)0x0;
        phVar34->mb_aff_frame_flag = currSlice->mb_aff_frame_flag;
        phVar34->PicWidthInMbs = p_Vid->PicWidthInMbs;
        RVar30 = currSlice->frame_num;
        phVar34->pic_num = RVar30;
        phVar34->frame_num = RVar30;
        phVar34->chroma_format_idc = phVar8->chroma_format_idc;
        phVar34->frame_mbs_only_flag = phVar8->frame_mbs_only_flag;
        iVar48 = phVar8->frame_cropping_flag;
        phVar34->frame_cropping_flag = iVar48;
        if (iVar48 == 0) {
          uVar67 = 0;
          uVar78 = 0;
        }
        else {
          uVar67._0_4_ = phVar8->frame_crop_left_offset;
          uVar67._4_4_ = phVar8->frame_crop_right_offset;
          uVar78._0_4_ = phVar8->frame_crop_top_offset;
          uVar78._4_4_ = phVar8->frame_crop_bottom_offset;
        }
        phVar34->frame_crop_left_offset = (int)uVar67;
        phVar34->frame_crop_right_offset = (int)((ulong)uVar67 >> 0x20);
        phVar34->frame_crop_top_offset = (int)uVar78;
        phVar34->frame_crop_bottom_offset = (int)((ulong)uVar78 >> 0x20);
        RVar76 = p_Vid->height;
        RVar30 = p_Vid->width_after_crop;
        RVar32 = p_Vid->height_after_crop;
        phVar34->width = p_Vid->width;
        phVar34->height = RVar76;
        phVar34->width_after_crop = RVar30;
        phVar34->height_after_crop = RVar32;
        RVar30 = get_field_dpb_combine_flag(phVar9->last_picture,phVar34);
        phVar34->combine_flag = RVar30;
        phVar16 = p_Vid->p_Dec;
        uVar39 = phVar34->structure;
        lVar42 = (long)phVar34->layer_id;
        if (RVar30 == 0) {
          phVar13 = phVar16->dpb_mark;
          bVar65 = 1;
          while (((phVar13[(byte)(bVar65 - 1)].out_flag != '\0' ||
                  (phVar74 = phVar13 + (byte)(bVar65 - 1), phVar74->top_used != '\0')) ||
                 (phVar74->bot_used != '\0'))) {
            if (((0x22 < bVar65) && ((h264d_debug & 2) != 0)) &&
               (_mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,"35 > idx",
                           "dpb_mark_malloc",0x195), (mpp_debug._3_1_ & 0x10) != 0))
            goto LAB_0019a801;
            bVar65 = bVar65 + 1;
          }
          mpp_buf_slot_get_unused(p_Vid->p_Dec->frame_slots,&phVar74->slot_idx);
          if (phVar74->slot_idx < 0) {
            if ((h264d_debug & 4) == 0) goto LAB_001980b8;
            pcVar50 = "[dpb_mark_malloc] error, buf_slot has not get.";
            goto LAB_001981eb;
          }
          phVar74->out_flag = '\x01';
          pvVar17 = phVar16->curframe;
          MVar6 = (phVar16->cfg->base).out_fmt;
          iVar48 = p_Vid->yuv_format;
          MVar55 = MPP_FMT_YUV_BUTT;
          if (iVar48 == 2) {
            if (p_Vid->bit_depth_luma == 10) {
              mpp_slots_set_prop(phVar16->frame_slots,SLOTS_LEN_ALIGN,rkv_len_align_422);
              MVar55 = MPP_FMT_YUV422SP_10BIT;
            }
            else if (p_Vid->bit_depth_luma == 8) {
              mpp_slots_set_prop(phVar16->frame_slots,SLOTS_LEN_ALIGN,rkv_len_align_422);
              MVar55 = MPP_FMT_YUV422SP;
            }
          }
          else if (iVar48 == 1) {
            MVar51 = MPP_FMT_YUV_BUTT;
            if (p_Vid->bit_depth_luma == 10) {
              MVar51 = MPP_FMT_YUV420SP_10BIT;
            }
            MVar55 = MPP_FMT_YUV420SP;
            if (p_Vid->bit_depth_luma != 8) {
              MVar55 = MVar51;
            }
          }
          else if (iVar48 == 0) {
            MVar55 = (uint)(p_Vid->bit_depth_luma != 8) * 8 + MPP_FMT_YUV400;
          }
          MVar51 = MVar6 & 0xf00000;
          if (MVar51 == MPP_FMT_YUV420SP) {
            bVar77 = true;
            if ((MVar6 >> 0x19 & 1) != 0) {
              MVar55 = MVar55 | 0x2000000;
              goto LAB_00197c5e;
            }
          }
          else {
            if (((p_Vid->frame_mbs_only_flag != 0) || (9 < p_Vid->bit_depth_luma)) &&
               ((((phVar16->cfg->base).enable_vproc & 2) == 0 ||
                (((0x780 < p_Vid->width || (0x440 < p_Vid->height)) || (p_Vid->bit_depth_luma != 8))
                )))) {
              mpp_slots_set_prop(phVar16->frame_slots,SLOTS_HOR_ALIGN,hor_align_64);
              MVar55 = MVar55 | MVar51;
            }
LAB_00197c5e:
            (phVar16->cfg->base).out_fmt = MVar55;
            bVar77 = (MVar55 & 0xf00000) == MPP_FMT_YUV420SP;
          }
          *(MppFrameFormat *)((long)pvVar17 + 0x68) = MVar55;
          RVar30 = p_Vid->bit_depth_luma;
          iVar48 = p_Vid->width;
          iVar53 = p_Vid->height;
          *(RK_U32 *)((long)pvVar17 + 0x10) = RVar30 * iVar48 + 7 >> 3;
          *(int *)((long)pvVar17 + 0x14) = iVar53;
          uVar18._0_4_ = p_Vid->width_after_crop;
          uVar18._4_4_ = p_Vid->height_after_crop;
          *(undefined8 *)((long)pvVar17 + 8) = uVar18;
          RVar25 = p_Vid->p_Cur->last_dts;
          *(RK_S64 *)((long)pvVar17 + 0x38) = p_Vid->p_Cur->last_pts;
          *(RK_S64 *)((long)pvVar17 + 0x40) = RVar25;
          if (!bVar77) {
            *(undefined8 *)((long)pvVar17 + 0x20) = 0x400000000;
            if (*compat_ext_fbc_buf_size != 0) {
              *(int *)((long)pvVar17 + 0x14) = iVar53 + 0x10;
            }
            *(uint *)((long)pvVar17 + 0x1c) = (undefined4)uVar18 + 0x3f & 0xffffffc0;
            if (*compat_ext_fbc_hdr_256_odd != 0) {
              *(uint *)((long)pvVar17 + 0x1c) = (undefined4)uVar18 + 0xff & 0xfffffe00 | 0x100;
            }
          }
          if (uVar39 == 1) {
            *(undefined4 *)((long)pvVar17 + 0x28) = 7;
          }
          else if (uVar39 == 2) {
            *(undefined4 *)((long)pvVar17 + 0x28) = 0xb;
          }
          else if (uVar39 == 3) {
            *(undefined4 *)((long)pvVar17 + 0x28) = 0;
            if (((RVar30 == 8 && (iVar53 < 0x441 && iVar48 < 0x781)) &
                (byte)(phVar16->cfg->base).enable_vproc >> 1) == 1) {
              *(undefined4 *)((long)pvVar17 + 0x28) = 0xc;
            }
          }
          else {
            if ((h264d_debug & 0x20000) != 0) {
              _mpp_log_l(4,"h264d_init","Unknown interlace mode",(char *)0x0);
            }
            _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                       "dpb_mark_malloc",0x1fb);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0019a801;
          }
          if (((phVar16->svc_valid != '\0') && ((phVar16->p_Cur->slice).svcExt.valid != 0)) &&
             (*(MppMeta *)((long)pvVar17 + 0xb0) != (MppMeta)0x0)) {
            mpp_meta_set_s32(*(MppMeta *)((long)pvVar17 + 0xb0),KEY_TEMPORAL_ID,
                             (phVar16->p_Cur->slice).svcExt.temporal_id);
          }
          phVar19 = p_Vid->p_Cur->sei;
          if (phVar19 != (h264_sei_t *)0x0) {
            if (((p_Vid->active_sps->vui_parameters_present_flag == 0) ||
                ((p_Vid->active_sps->vui_seq_parameters).pic_struct_present_flag == 0)) ||
               (phVar19->type != 1)) {
              RVar76 = (phVar19->pic_timing).pic_struct;
              if (RVar76 == 0) goto switchD_00197e95_default;
            }
            else {
              RVar76 = (phVar19->pic_timing).pic_struct;
            }
            switch(RVar76) {
            case 3:
            case 5:
              *(undefined4 *)((long)pvVar17 + 0x28) = 7;
              if (RVar76 == 4) goto switchD_00197e95_caseD_4;
              break;
            case 4:
            case 6:
switchD_00197e95_caseD_4:
              *(undefined4 *)((long)pvVar17 + 0x28) = 0xb;
            }
          }
switchD_00197e95_default:
          RVar30 = (phVar16->cfg->base).enable_thumbnail;
          if (RVar30 == 0) {
            s = phVar16->curframe;
LAB_00197ed9:
            RVar30 = 0;
          }
          else {
            s = phVar16->curframe;
            if ((phVar16->hw_info->field_0x6 & 8) == 0) goto LAB_00197ed9;
          }
          mpp_frame_set_thumbnail_en(s,RVar30);
          phVar8 = p_Vid->active_sps;
          if (phVar8->vui_parameters_present_flag != 0) {
            if (((phVar8->vui_seq_parameters).video_signal_type_present_flag == 0) ||
               (uVar41 = 2, (phVar8->vui_seq_parameters).video_full_range_flag == 0)) {
              uVar41 = 1;
            }
            *(undefined4 *)((long)pvVar17 + 0x54) = uVar41;
            if ((phVar8->vui_seq_parameters).colour_description_present_flag == 0) {
              *(undefined8 *)((long)pvVar17 + 0x58) = 0x200000002;
              *(undefined4 *)((long)pvVar17 + 0x60) = 2;
            }
            else {
              *(RK_U32 *)((long)pvVar17 + 0x58) = (phVar8->vui_seq_parameters).colour_primaries;
              uVar20._0_4_ = (phVar8->vui_seq_parameters).transfer_characteristics;
              uVar20._4_4_ = (phVar8->vui_seq_parameters).matrix_coefficients;
              *(undefined8 *)((long)pvVar17 + 0x5c) = uVar20;
              if ((undefined4)uVar20 == 0x10) {
                *(byte *)((long)pvVar17 + 0x6b) = *(byte *)((long)pvVar17 + 0x6b) | 4;
              }
            }
          }
          phVar21 = p_Vid->p_Cur;
          if ((phVar21->hdr_dynamic != 0) &&
             (phVar21->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0)) {
            *(MppFrameHdrDynamicMeta **)((long)pvVar17 + 0x90) = phVar21->hdr_dynamic_meta;
            phVar21->hdr_dynamic = 0;
            *(byte *)((long)pvVar17 + 0x6b) = *(byte *)((long)pvVar17 + 0x6b) | 4;
          }
          *(RK_S32 *)((long)pvVar17 + 0x34) = phVar34->poc;
          *(RK_S32 *)((long)pvVar17 + 0x30) = phVar34->layer_id;
          uVar28 = ((ushort)*(undefined4 *)((long)pvVar17 + 0xd8) & 0xfffd) +
                   (ushort)(phVar34->slice_type == 2) * 2;
          *(ushort *)((long)pvVar17 + 0xd8) = uVar28;
          uVar28 = (uVar28 & 0xfffb) + ((ushort)phVar34->idr_flag & 1) * 4;
          *(ushort *)((long)pvVar17 + 0xd8) = uVar28;
          uVar29 = (uVar28 & 0xfff7) + (ushort)(phVar34->used_for_reference == 0) * 8;
          *(ushort *)((long)pvVar17 + 0xd8) = uVar29;
          uVar28 = (ushort)((phVar34->long_term_reference_flag & 1U) << 4);
          *(ushort *)((long)pvVar17 + 0xd8) = uVar29 & 0xffef | uVar28;
          *(ushort *)((long)pvVar17 + 0xd8) =
               uVar29 & 0xffcf | uVar28 | (ushort)(phVar34->slice_type % 5 == 1) << 5;
          mpp_buf_slot_set_prop(phVar16->frame_slots,phVar74->slot_idx,SLOT_FRAME,phVar16->curframe)
          ;
          mpp_buf_slot_get_prop
                    (phVar16->frame_slots,phVar74->slot_idx,SLOT_FRAME_PTR,&phVar74->mframe);
          p_Vid->active_dpb_mark[lVar42] = phVar74;
          goto LAB_00198068;
        }
        phVar74 = p_Vid->active_dpb_mark[lVar42];
LAB_00198068:
        uVar56 = phVar74->slot_idx;
        if ((int)uVar56 < 0) {
          if ((h264d_debug & 4) == 0) {
LAB_001980b8:
            phVar34->mem_mark = (h264_dpb_mark_t *)0x0;
            MVar33 = MPP_NOK;
          }
          else {
            pcVar50 = "[dpb_mark_malloc] error, current mark slot idx is nagative.";
LAB_001981eb:
            MVar33 = MPP_NOK;
            _mpp_log_l(4,"h264d_init",pcVar50,(char *)0x0);
            uVar39 = h264d_debug & 4;
            phVar34->mem_mark = (h264_dpb_mark_t *)0x0;
            if (uVar39 != 0) {
              uVar67 = 0x2d9;
              goto LAB_00196ee3;
            }
          }
          goto LAB_0019821d;
        }
        if ((uVar39 & 0xfffffffd) == 1) {
          phVar74->top_used = phVar74->top_used + '\x01';
        }
        if ((uVar39 & 0xfffffffe) == 2) {
          phVar74->bot_used = phVar74->bot_used + '\x01';
        }
        if ((h264d_debug & 0x200) != 0) {
          _mpp_log_l(4,"h264d_init",
                     "[DPB_malloc] g_framecnt=%d, com_flag=%d, mark_idx=%d, slot_idx=%d, slice_type=%d, struct=%d, lay_id=%d\n"
                     ,(char *)0x0,(ulong)p_Vid->g_framecnt,(ulong)(uint)phVar34->combine_flag,
                     (ulong)phVar74->mark_idx,(ulong)uVar56,(ulong)(uint)phVar34->slice_type,
                     (ulong)(uint)phVar34->structure,lVar42);
          uVar56 = phVar74->slot_idx;
        }
        p_Vid->p_Dec->in_task->output = uVar56;
        mpp_buf_slot_set_flag(phVar16->frame_slots,uVar56,SLOT_HAL_OUTPUT);
        phVar16->last_frame_slot_idx = phVar74->slot_idx;
        phVar13 = p_Vid->active_dpb_mark[lVar42];
        phVar34->mem_mark = phVar13;
        phVar13->pic = phVar34;
        if ((phVar7->cfg->base).disable_dpb_chk == 0) {
          phVar43 = p_Vid->last_pic;
          if (((phVar43 != (h264_store_pic_t *)0x0) && (uVar39 = phVar34->slice_type, uVar39 != 2))
             && ((currSlice->p_Cur->sps).gaps_in_frame_num_value_allowed_flag == 0)) {
            if (phVar34->combine_flag == 0) {
              uVar56 = currSlice->p_Vid->last_ref_frame_num;
              uVar44 = (ulong)uVar56;
              uVar57 = phVar34->frame_num;
              if (uVar57 == uVar56) {
                bVar77 = false;
              }
              else {
                bVar77 = uVar57 != (uVar56 + 1) % (uint)currSlice->p_Vid->max_frame_num;
                uVar44 = (ulong)uVar57;
              }
            }
            else {
              uVar44 = (ulong)phVar34->frame_num;
              bVar77 = phVar34->frame_num != phVar43->frame_num;
            }
            phVar16 = currSlice->p_Dec;
            pRVar2 = &(phVar16->errctx).cur_err_flag;
            *pRVar2 = *pRVar2 | (uint)bVar77;
            pRVar2 = &(phVar16->errctx).dpb_err_flag;
            *pRVar2 = *pRVar2 | (uint)bVar77;
            if ((h264d_debug & 0x40000) != 0) {
              _mpp_log_l(4,"h264d_init",
                         "[discontinuous] last_slice=%d, cur_slice=%d, last_fnum=%d, cur_fnum=%d, last_poc=%d, cur_poc=%d"
                         ,(char *)0x0,(ulong)(uint)phVar43->slice_type,(ulong)uVar39,
                         (ulong)phVar43->frame_num,uVar44,(ulong)(uint)phVar43->poc,
                         (ulong)(uint)phVar34->poc);
            }
          }
          if ((phVar34->idr_flag != 0) || (phVar34->used_for_reference != 0)) {
            currSlice->p_Vid->last_ref_frame_num = phVar34->frame_num;
          }
        }
        phVar34->mem_malloc_type = Mem_Malloc;
        phVar34->colmv_no_used_flag = '\0';
        p_Vid->dec_pic = phVar34;
        if (((((phVar7->errctx).i_slice_no < 2) && (currSlice->layer_id == 0)) &&
            (currSlice->slice_type == 2)) || (currSlice->idr_flag != 0)) {
          (phVar7->errctx).first_iframe_poc = phVar34->poc;
          (phVar7->errctx).first_iframe_is_output = 0;
        }
        iVar48 = currSlice->layer_id;
        if (((iVar48 != 0) && (currSlice->svc_extension_flag == 0)) &&
           ((currSlice->mvcExt).non_idr_flag == 0)) {
          if ((iVar48 != 1) && ((h264d_debug & 2) != 0)) {
            _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "currSlice->layer_id == 1","init_picture",0x81c);
            if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0019a801:
              abort();
            }
            iVar48 = currSlice->layer_id;
            phVar34 = p_Vid->dec_pic;
          }
          MVar33 = idr_memory_management(p_Vid->p_Dpb_layer[iVar48],phVar34);
          if (MVar33 < MPP_OK) {
            if ((h264d_debug & 4) == 0) {
              return MVar33;
            }
            uVar67 = 0x81d;
            goto LAB_00198265;
          }
        }
        phVar34 = p_Vid->last_pic;
        if (phVar34 != (h264_store_pic_t *)0x0) {
          phVar43 = p_Vid->dec_pic;
          if (((phVar43->poc != 0) && (phVar43->frame_num <= phVar34->frame_num)) &&
             ((phVar43->poc <= phVar34->poc &&
              ((phVar43->slice_type == 2 && (phVar43->structure == 3)))))) {
            if (currSlice->layer_id == 0) {
              MVar33 = flush_dpb(p_Vid->p_Dpb_layer[0],1);
              if (MVar33 < MPP_OK) {
                if ((h264d_debug & 4) == 0) {
                  return MVar33;
                }
                uVar67 = 0x827;
                goto LAB_00198265;
              }
            }
            else {
              MVar33 = flush_dpb(p_Vid->p_Dpb_layer[1],2);
              if (MVar33 < MPP_OK) {
                if ((h264d_debug & 4) == 0) {
                  return MVar33;
                }
                uVar67 = 0x829;
                goto LAB_00198265;
              }
            }
          }
        }
        update_ref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
        update_ltref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
        phVar22 = currSlice->p_Vid;
        iVar48 = 1 << ((char)phVar22->active_sps->log2_max_frame_num_minus4 + 4U & 0x1f);
        phVar9 = currSlice->p_Dpb;
        if (currSlice->idr_flag == 0) {
          iVar53 = currSlice->structure;
          if (iVar53 == 1) {
            iVar47 = 0;
            iVar58 = 1;
LAB_00198725:
            uVar39 = phVar9->ref_frames_in_buffer;
            if ((ulong)uVar39 != 0) {
              pphVar37 = phVar9->fs_ref;
              uVar44 = 0;
              do {
                phVar70 = pphVar37[uVar44];
                uVar56 = phVar70->is_reference;
                if (uVar56 != 0) {
                  iVar52 = iVar48;
                  if ((int)phVar70->frame_num <= currSlice->frame_num) {
                    iVar52 = 0;
                  }
                  iVar52 = phVar70->frame_num - iVar52;
                  phVar70->frame_num_wrap = iVar52;
                  if ((uVar56 & 1) != 0) {
                    phVar70->top_field->pic_num = iVar58 + iVar52 * 2;
                  }
                  if ((uVar56 & 2) != 0) {
                    phVar70->bottom_field->pic_num = iVar47 + iVar52 * 2;
                  }
                }
                uVar44 = uVar44 + 1;
              } while (uVar39 != uVar44);
            }
            uVar39 = phVar9->ltref_frames_in_buffer;
            if ((ulong)uVar39 != 0) {
              pphVar37 = phVar9->fs_ltref;
              uVar44 = 0;
              do {
                phVar70 = pphVar37[uVar44];
                uVar56 = phVar70->is_long_term;
                if ((uVar56 & 1) != 0) {
                  phVar70->top_field->long_term_pic_num =
                       iVar58 + phVar70->top_field->long_term_frame_idx * 2;
                }
                if ((uVar56 & 2) != 0) {
                  phVar70->bottom_field->long_term_pic_num =
                       iVar47 + phVar70->bottom_field->long_term_frame_idx * 2;
                }
                uVar44 = uVar44 + 1;
              } while (uVar39 != uVar44);
            }
            goto LAB_001987d4;
          }
          if (iVar53 != 3) {
            iVar47 = 1;
            iVar58 = 0;
            goto LAB_00198725;
          }
          uVar39 = phVar9->ref_frames_in_buffer;
          if ((ulong)uVar39 != 0) {
            pphVar37 = phVar9->fs_ref;
            uVar44 = 0;
            do {
              phVar70 = pphVar37[uVar44];
              if (((phVar70->is_used == 3) &&
                  (phVar34 = phVar70->frame, phVar34->used_for_reference != 0)) &&
                 (phVar34->is_long_term == '\0')) {
                iVar53 = 0;
                if (currSlice->frame_num < (int)phVar70->frame_num) {
                  iVar53 = iVar48;
                }
                iVar53 = phVar70->frame_num - iVar53;
                phVar70->frame_num_wrap = iVar53;
                phVar34->pic_num = iVar53;
              }
              uVar44 = uVar44 + 1;
            } while (uVar39 != uVar44);
          }
          uVar39 = phVar9->ltref_frames_in_buffer;
          if ((ulong)uVar39 != 0) {
            pphVar37 = phVar9->fs_ltref;
            uVar44 = 0;
            do {
              if ((pphVar37[uVar44]->is_used == 3) &&
                 (phVar34 = pphVar37[uVar44]->frame, phVar34->is_long_term != '\0')) {
                phVar34->long_term_pic_num = phVar34->long_term_frame_idx;
              }
              uVar44 = uVar44 + 1;
            } while (uVar39 != uVar44);
          }
          RVar76 = currSlice->ThisPOC;
          currSlice->listinterviewidx0 = 0;
          currSlice->listinterviewidx1 = 0;
          currSlice->listXsizeP[0] = '\0';
          currSlice->listXsizeP[1] = '\0';
LAB_00198820:
          local_d0 = currSlice->listXsizeP;
          uVar39 = phVar9->ref_frames_in_buffer;
          if ((ulong)uVar39 == 0) {
            uVar56 = 0;
          }
          else {
            uVar44 = 0;
            uVar56 = 0;
            do {
              if (((phVar9->fs_ref[uVar44]->is_used == 3) &&
                  (phVar34 = phVar9->fs_ref[uVar44]->frame, phVar34->used_for_reference != 0)) &&
                 (phVar34->is_long_term == '\0')) {
                lVar42 = (long)(int)uVar56;
                uVar56 = uVar56 + 1;
                currSlice->listP[0][lVar42] = phVar34;
              }
              uVar44 = uVar44 + 1;
            } while (uVar39 != uVar44);
          }
          sVar75 = (size_t)(int)uVar56;
          qsort(currSlice->listP[0],sVar75,8,compare_pic_by_pic_num_desc);
          bVar65 = (byte)uVar56;
          currSlice->listXsizeP[0] = bVar65;
          uVar39 = phVar9->ltref_frames_in_buffer;
          if ((ulong)uVar39 != 0) {
            uVar44 = 0;
            do {
              if ((phVar9->fs_ltref[uVar44]->is_used == 3) &&
                 (phVar34 = phVar9->fs_ltref[uVar44]->frame, phVar34->is_long_term != '\0')) {
                lVar42 = (long)(int)uVar56;
                uVar56 = uVar56 + 1;
                currSlice->listP[0][lVar42] = phVar34;
              }
              uVar44 = uVar44 + 1;
            } while (uVar39 != uVar44);
            bVar65 = *local_d0;
            sVar75 = (size_t)uVar56;
          }
          qsort((void *)((ulong)((uint)bVar65 * 8) + (long)currSlice->listP[0]),
                (long)(int)(uVar56 - bVar65),8,compare_pic_by_lt_pic_num_asc);
          currSlice->listXsizeP[0] = (RK_U8)sVar75;
LAB_00198b2c:
          local_a8 = &currSlice->listinterviewidx0;
          local_d0 = currSlice->listXsizeP;
          currSlice->listXsizeP[1] = 0;
          RVar62 = (RK_S32)local_a8;
          if ((((currSlice->mvcExt).valid != 0) && (phVar22->active_mvc_sps_flag != 0)) &&
             (currSlice->svc_extension_flag == 0)) {
            RVar31 = currSlice->layer_id;
            pphVar37 = (h264_frame_store_t **)
                       mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar9->size << 3);
            currSlice->fs_listinterview0 = pphVar37;
            if (pphVar37 == (h264_frame_store_t **)0x0) {
              MVar33 = MPP_ERR_MALLOC;
              if ((h264d_debug & 1) != 0) {
                pcVar50 = "malloc buffer error(%d).\n";
                uVar67 = 0x47f;
LAB_0019a679:
                _mpp_log_l(4,"h264d_init",pcVar50,(char *)0x0,uVar67);
              }
            }
            else if (currSlice->structure == 3) {
              bVar65 = *local_d0;
              MVar33 = append_interview_list
                                 ((H264_DpbBuf_t *)*phVar22->p_Dpb_layer[1]->fs_ilref,
                                  (RK_S32)phVar22->p_Dpb_layer[1]->p_Vid,3,(H264_FrameStore_t **)0x0
                                  ,(RK_S32 *)pphVar37,RVar62,RVar76,RVar31);
              if (MPP_NOK < MVar33) {
                uVar39 = *local_a8;
                if ((ulong)uVar39 != 0) {
                  uVar44 = 0;
                  do {
                    *(h264_store_pic_t **)
                     ((long)currSlice->listP[0] + uVar44 * 8 + (ulong)((uint)bVar65 * 8)) =
                         currSlice->fs_listinterview0[uVar44]->frame;
                    uVar44 = uVar44 + 1;
                  } while (uVar39 != uVar44);
                  bVar65 = bVar65 + (char)uVar44;
                }
                *local_d0 = bVar65;
                goto LAB_00198b60;
              }
              if ((h264d_debug & 4) != 0) {
                pcVar50 = "Function error(%d).\n";
                uVar67 = 0x483;
                goto LAB_0019a679;
              }
            }
            else {
              MVar33 = append_interview_list
                                 ((H264_DpbBuf_t *)*phVar22->p_Dpb_layer[1]->fs_ilref,
                                  (RK_S32)phVar22->p_Dpb_layer[1]->p_Vid,currSlice->structure,
                                  (H264_FrameStore_t **)0x0,(RK_S32 *)pphVar37,RVar62,RVar76,RVar31)
              ;
              if (MPP_NOK < MVar33) {
                gen_pic_list_from_frame_interview_list
                          (currSlice->structure,currSlice->fs_listinterview0,
                           currSlice->listinterviewidx0,currSlice->listP[0],local_d0);
                goto LAB_00198b58;
              }
              if ((h264d_debug & 4) != 0) {
                pcVar50 = "Function error(%d).\n";
                uVar67 = 0x48a;
                goto LAB_0019a679;
              }
            }
LAB_001989f4:
            if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
              mpp_osal_free("init_lists_p_slice_mvc",currSlice->fs_listinterview0);
            }
            currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
            if ((h264d_debug & 4) == 0) {
              return MVar33;
            }
            uVar67 = 0x832;
            goto LAB_00198265;
          }
LAB_00198b58:
          bVar65 = *local_d0;
LAB_00198b60:
          if (bVar65 < 0x21) {
            uVar44 = (ulong)bVar65;
            phVar34 = phVar22->no_ref_pic;
            do {
              currSlice->listP[0][uVar44] = phVar34;
              uVar44 = uVar44 + 1;
            } while (uVar44 != 0x21);
          }
          uVar44 = (ulong)currSlice->listXsizeP[1];
          if (uVar44 < 0x21) {
            phVar34 = phVar22->no_ref_pic;
            do {
              currSlice->listP[1][uVar44] = phVar34;
              uVar44 = uVar44 + 1;
            } while (uVar44 != 0x21);
          }
          if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
            mpp_osal_free("init_lists_p_slice_mvc",currSlice->fs_listinterview0);
          }
          uVar39 = 0;
          currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
          phVar22 = currSlice->p_Vid;
          phVar9 = currSlice->p_Dpb;
          iVar48 = currSlice->structure;
          RVar76 = currSlice->ThisPOC;
          list_size = currSlice->listXsizeB;
          currSlice->listXsizeB[0] = '\0';
          currSlice->listXsizeB[1] = '\0';
          list_size_00 = currSlice->listXsizeB + 1;
          currSlice->listinterviewidx0 = 0;
          currSlice->listinterviewidx1 = 0;
          if (iVar48 == 3) {
            uVar56 = phVar9->ref_frames_in_buffer;
            if ((ulong)uVar56 != 0) {
              uVar44 = 0;
              uVar39 = 0;
              do {
                if ((((phVar9->fs_ref[uVar44]->is_used == 3) &&
                     (phVar34 = phVar9->fs_ref[uVar44]->frame, phVar34->used_for_reference != 0)) &&
                    (phVar34->is_long_term == '\0')) && (phVar34->poc <= *pRVar68)) {
                  lVar42 = (long)(int)uVar39;
                  uVar39 = uVar39 + 1;
                  currSlice->listB[0][lVar42] = phVar34;
                }
                uVar44 = uVar44 + 1;
              } while (uVar56 != uVar44);
            }
            sVar75 = (size_t)(int)uVar39;
            qsort(currSlice->listB[0],sVar75,8,compare_pic_by_poc_desc);
            uVar56 = phVar9->ref_frames_in_buffer;
            uVar44 = (ulong)uVar39;
            if ((ulong)uVar56 != 0) {
              uVar60 = 0;
              uVar44 = (ulong)uVar39;
              do {
                if (((phVar9->fs_ref[uVar60]->is_used == 3) &&
                    (phVar34 = phVar9->fs_ref[uVar60]->frame, phVar34->used_for_reference != 0)) &&
                   ((phVar34->is_long_term == '\0' && (*pRVar68 < phVar34->poc)))) {
                  iVar48 = (int)uVar44;
                  uVar44 = (ulong)(iVar48 + 1);
                  currSlice->listB[0][iVar48] = phVar34;
                }
                uVar60 = uVar60 + 1;
              } while (uVar56 != uVar60);
            }
            iVar48 = (int)uVar44;
            qsort(currSlice->listB[0] + sVar75,(long)(int)(iVar48 - uVar39),8,compare_pic_by_poc_asc
                 );
            if (0 < (int)uVar39) {
              uVar60 = 0;
              do {
                currSlice->listB[1][((long)iVar48 + uVar60) - sVar75] = currSlice->listB[0][uVar60];
                uVar60 = uVar60 + 1;
              } while (uVar39 != uVar60);
            }
            if ((int)uVar39 < iVar48) {
              lVar42 = 0;
              do {
                currSlice->listB[1][lVar42] = currSlice->listB[0][sVar75 + lVar42];
                lVar42 = lVar42 + 1;
              } while ((long)iVar48 - sVar75 != lVar42);
            }
            bVar65 = (byte)uVar44;
            *list_size_00 = bVar65;
            *list_size = bVar65;
            uVar39 = phVar9->ltref_frames_in_buffer;
            if ((ulong)uVar39 != 0) {
              uVar60 = 0;
              do {
                if ((phVar9->fs_ltref[uVar60]->is_used == 3) &&
                   (phVar34 = phVar9->fs_ltref[uVar60]->frame, phVar34->is_long_term != '\0')) {
                  iVar48 = (int)uVar44;
                  currSlice->listB[0][iVar48] = phVar34;
                  uVar44 = (ulong)(iVar48 + 1);
                  currSlice->listB[1][iVar48] = phVar9->fs_ltref[uVar60]->frame;
                }
                uVar60 = uVar60 + 1;
              } while (uVar39 != uVar60);
              bVar65 = *list_size;
            }
            qsort((void *)((ulong)((uint)bVar65 * 8) + (long)currSlice->listB[0]),
                  (long)(int)((int)uVar44 - (uint)bVar65),8,compare_pic_by_lt_pic_num_asc);
            qsort(currSlice->listB[1] + currSlice->listXsizeB[0],
                  (long)(int)uVar44 - (ulong)currSlice->listXsizeB[0],8,
                  compare_pic_by_lt_pic_num_asc);
            bVar65 = (byte)uVar44;
            currSlice->listXsizeB[1] = bVar65;
            currSlice->listXsizeB[0] = bVar65;
LAB_00199263:
            if (1 < bVar65 && bVar65 == (byte)uVar44) {
              pphVar23 = currSlice->listB[1];
              uVar60 = 0;
              do {
                if (currSlice->listB[0][uVar60] != pphVar23[uVar60]) goto LAB_001992ad;
                uVar60 = uVar60 + 1;
              } while ((uVar44 & 0xff) != uVar60);
              phVar34 = *pphVar23;
              *pphVar23 = pphVar23[1];
              currSlice->listB[1][1] = phVar34;
            }
LAB_001992ad:
            if ((((currSlice->mvcExt).valid == 0) || (phVar22->active_mvc_sps_flag == 0)) ||
               (currSlice->svc_extension_flag != 0)) {
LAB_001992cc:
              uVar44 = (ulong)*list_size;
              if (uVar44 < 0x21) {
                phVar34 = phVar22->no_ref_pic;
                do {
                  currSlice->listB[0][uVar44] = phVar34;
                  uVar44 = uVar44 + 1;
                } while (uVar44 != 0x21);
              }
              uVar44 = (ulong)*list_size_00;
              if (uVar44 < 0x21) {
                phVar34 = phVar22->no_ref_pic;
                do {
                  currSlice->listB[1][uVar44] = phVar34;
                  uVar44 = uVar44 + 1;
                } while (uVar44 != 0x21);
              }
              if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
                mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview0);
              }
              currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
              if (currSlice->fs_listinterview1 != (h264_frame_store_t **)0x0) {
                mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview1);
                currSlice->fs_listinterview1 = (h264_frame_store_t **)0x0;
              }
              goto LAB_00199369;
            }
            RVar31 = currSlice->layer_id;
            pphVar37 = (h264_frame_store_t **)
                       mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar9->size << 3);
            currSlice->fs_listinterview0 = pphVar37;
            pphVar38 = (h264_frame_store_t **)
                       mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar9->size << 3);
            currSlice->fs_listinterview1 = pphVar38;
            pphVar37 = currSlice->fs_listinterview0;
            if ((pphVar37 == (h264_frame_store_t **)0x0) || (pphVar38 == (h264_frame_store_t **)0x0)
               ) {
              MVar33 = MPP_ERR_MALLOC;
              if ((h264d_debug & 1) != 0) {
                pcVar50 = "malloc buffer error(%d).\n";
                uVar67 = 0x528;
                goto LAB_0019a2c2;
              }
            }
            else {
              phVar70 = *phVar22->p_Dpb_layer[1]->fs_ilref;
              RVar59 = (RK_S32)phVar22->p_Dpb_layer[1]->p_Vid;
              currPOC = (RK_S32)&currSlice->listinterviewidx1;
              if (currSlice->structure == 3) {
                bVar65 = currSlice->listXsizeB[0];
                MVar33 = append_interview_list
                                   ((H264_DpbBuf_t *)phVar70,RVar59,3,(H264_FrameStore_t **)0x0,
                                    (RK_S32 *)pphVar37,RVar62,RVar76,RVar31);
                if (MVar33 < MPP_OK) {
                  if ((h264d_debug & 4) != 0) {
                    pcVar50 = "Function error(%d).\n";
                    uVar67 = 0x52c;
LAB_0019a2c2:
                    _mpp_log_l(4,"h264d_init",pcVar50,(char *)0x0,uVar67);
                  }
                }
                else {
                  MVar33 = append_interview_list
                                     ((H264_DpbBuf_t *)*phVar22->p_Dpb_layer[1]->fs_ilref,
                                      (RK_S32)phVar22->p_Dpb_layer[1]->p_Vid,currSlice->structure,
                                      (H264_FrameStore_t **)0x1,
                                      (RK_S32 *)currSlice->fs_listinterview1,currPOC,RVar76,RVar31);
                  if (MPP_NOK < MVar33) {
                    uVar39 = *local_a8;
                    if ((ulong)uVar39 != 0) {
                      uVar44 = 0;
                      do {
                        *(h264_store_pic_t **)
                         ((long)currSlice->listB[0] + uVar44 * 8 + (ulong)((uint)bVar65 * 8)) =
                             currSlice->fs_listinterview0[uVar44]->frame;
                        uVar44 = uVar44 + 1;
                      } while (uVar39 != uVar44);
                      bVar65 = bVar65 + (char)uVar44;
                    }
                    *list_size = bVar65;
                    bVar65 = *list_size_00;
                    uVar44 = (ulong)(uint)currSlice->listinterviewidx1;
                    if (uVar44 != 0) {
                      uVar60 = 0;
                      do {
                        *(h264_store_pic_t **)
                         ((long)currSlice->listB[1] + uVar60 * 8 + (ulong)((uint)bVar65 * 8)) =
                             currSlice->fs_listinterview1[uVar60]->frame;
                        uVar60 = uVar60 + 1;
                      } while (uVar44 != uVar60);
                      bVar65 = bVar65 + (char)uVar60;
                    }
                    *list_size_00 = bVar65;
                    goto LAB_001992cc;
                  }
                  if ((h264d_debug & 4) != 0) {
                    pcVar50 = "Function error(%d).\n";
                    uVar67 = 0x52e;
                    goto LAB_0019a2c2;
                  }
                }
              }
              else {
                MVar33 = append_interview_list
                                   ((H264_DpbBuf_t *)phVar70,RVar59,currSlice->structure,
                                    (H264_FrameStore_t **)0x0,(RK_S32 *)pphVar37,RVar62,RVar76,
                                    RVar31);
                if (MVar33 < MPP_OK) {
                  if ((h264d_debug & 4) != 0) {
                    pcVar50 = "Function error(%d).\n";
                    uVar67 = 0x53b;
                    goto LAB_0019a2c2;
                  }
                }
                else {
                  gen_pic_list_from_frame_interview_list
                            (currSlice->structure,currSlice->fs_listinterview0,
                             currSlice->listinterviewidx0,currSlice->listB[0],list_size);
                  MVar33 = append_interview_list
                                     ((H264_DpbBuf_t *)*phVar22->p_Dpb_layer[1]->fs_ilref,
                                      (RK_S32)phVar22->p_Dpb_layer[1]->p_Vid,currSlice->structure,
                                      (H264_FrameStore_t **)0x1,
                                      (RK_S32 *)currSlice->fs_listinterview1,currPOC,RVar76,RVar31);
                  if (MPP_NOK < MVar33) {
                    gen_pic_list_from_frame_interview_list
                              (currSlice->structure,currSlice->fs_listinterview1,
                               currSlice->listinterviewidx1,currSlice->listB[1],list_size_00);
                    goto LAB_001992cc;
                  }
                  if ((h264d_debug & 4) != 0) {
                    pcVar50 = "Function error(%d).\n";
                    uVar67 = 0x53f;
                    goto LAB_0019a2c2;
                  }
                }
              }
            }
          }
          else {
            ppHVar35 = (H264_FrameStore_t **)
                       mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar9->size << 3);
            ppHVar36 = (H264_FrameStore_t **)
                       mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar9->size << 3);
            fs_list = (H264_FrameStore_t **)
                      mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar9->size << 3);
            if (((ppHVar35 != (H264_FrameStore_t **)0x0) && (ppHVar36 != (H264_FrameStore_t **)0x0))
               && (fs_list != (H264_FrameStore_t **)0x0)) {
              *list_size = '\0';
              *list_size_00 = 1;
              uVar39 = phVar9->ref_frames_in_buffer;
              if ((ulong)uVar39 == 0) {
                uVar56 = 0;
              }
              else {
                uVar44 = 0;
                uVar56 = 0;
                do {
                  pHVar14 = phVar9->fs_ref[uVar44];
                  if ((pHVar14->is_used != 0) && (pHVar14->poc <= *pRVar1)) {
                    lVar42 = (long)(int)uVar56;
                    uVar56 = uVar56 + 1;
                    ppHVar35[lVar42] = pHVar14;
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar39 != uVar44);
              }
              sVar75 = (size_t)(int)uVar56;
              qsort(ppHVar35,sVar75,8,compare_fs_by_poc_desc);
              uVar39 = phVar9->ref_frames_in_buffer;
              uVar57 = uVar56;
              if ((ulong)uVar39 != 0) {
                uVar44 = 0;
                do {
                  pHVar14 = phVar9->fs_ref[uVar44];
                  if ((pHVar14->is_used != 0) && (*pRVar1 < pHVar14->poc)) {
                    lVar42 = (long)(int)uVar57;
                    uVar57 = uVar57 + 1;
                    ppHVar35[lVar42] = pHVar14;
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar39 != uVar44);
              }
              qsort(ppHVar35 + sVar75,(long)(int)(uVar57 - uVar56),8,compare_fs_by_poc_asc);
              if (0 < (int)uVar56) {
                uVar44 = 0;
                do {
                  ppHVar36[(long)(int)(uVar57 - uVar56) + uVar44] = ppHVar35[uVar44];
                  uVar44 = uVar44 + 1;
                } while (uVar56 != uVar44);
              }
              if ((int)uVar56 < (int)uVar57) {
                lVar42 = 0;
                do {
                  ppHVar36[lVar42] = (ppHVar35 + sVar75)[lVar42];
                  lVar42 = lVar42 + 1;
                } while ((long)(int)uVar57 - sVar75 != lVar42);
              }
              currSlice->listXsizeB[0] = '\0';
              currSlice->listXsizeB[1] = '\0';
              gen_pic_list_from_frame_list
                        (currSlice->structure,ppHVar35,uVar57,currSlice->listB[0],list_size,0);
              gen_pic_list_from_frame_list
                        (currSlice->structure,ppHVar36,uVar57,currSlice->listB[1],list_size_00,0);
              uVar39 = phVar9->ltref_frames_in_buffer;
              uVar44 = (ulong)uVar39;
              sVar75 = 0;
              if (uVar44 != 0) {
                uVar60 = 0;
                do {
                  fs_list[uVar60] = phVar9->fs_ltref[uVar60];
                  uVar60 = uVar60 + 1;
                  sVar75 = uVar44;
                } while (uVar44 != uVar60);
              }
              qsort(fs_list,sVar75,8,compare_fs_by_lt_pic_idx_asc);
              gen_pic_list_from_frame_list
                        (currSlice->structure,fs_list,uVar39,currSlice->listB[0],list_size,1);
              gen_pic_list_from_frame_list
                        (currSlice->structure,fs_list,uVar39,currSlice->listB[1],list_size_00,1);
              mpp_osal_free("init_lists_b_slice_mvc",ppHVar35);
              mpp_osal_free("init_lists_b_slice_mvc",ppHVar36);
              mpp_osal_free("init_lists_b_slice_mvc",fs_list);
              bVar65 = currSlice->listXsizeB[0];
              uVar44 = CONCAT71(0x2849,currSlice->listXsizeB[1]);
              goto LAB_00199263;
            }
            if ((h264d_debug & 1) != 0) {
              _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x4e7);
            }
            if (ppHVar35 != (H264_FrameStore_t **)0x0) {
              mpp_osal_free("init_lists_b_slice_mvc",ppHVar35);
            }
            if (ppHVar36 != (H264_FrameStore_t **)0x0) {
              mpp_osal_free("init_lists_b_slice_mvc",ppHVar36);
            }
            MVar33 = MPP_ERR_MALLOC;
            if (fs_list != (H264_FrameStore_t **)0x0) {
              mpp_osal_free("init_lists_b_slice_mvc",fs_list);
            }
          }
          if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
            mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview0);
          }
          currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
          if (currSlice->fs_listinterview1 != (h264_frame_store_t **)0x0) {
            mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview1);
          }
          currSlice->fs_listinterview1 = (h264_frame_store_t **)0x0;
          if ((h264d_debug & 4) == 0) {
            return MVar33;
          }
          uVar67 = 0x833;
        }
        else {
          if (currSlice->layer_id != 0) {
            iVar53 = currSlice->structure;
LAB_001987d4:
            RVar76 = currSlice->ThisPOC;
            currSlice->listinterviewidx0 = 0;
            currSlice->listinterviewidx1 = 0;
            currSlice->listXsizeP[0] = '\0';
            currSlice->listXsizeP[1] = '\0';
            if (iVar53 == 3) goto LAB_00198820;
            ppHVar35 = (H264_FrameStore_t **)
                       mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar9->size << 3);
            ppHVar36 = (H264_FrameStore_t **)
                       mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar9->size << 3);
            if (ppHVar36 != (H264_FrameStore_t **)0x0 && ppHVar35 != (H264_FrameStore_t **)0x0) {
              uVar39 = phVar9->ref_frames_in_buffer;
              if ((ulong)uVar39 == 0) {
                iVar48 = 0;
              }
              else {
                uVar44 = 0;
                iVar48 = 0;
                do {
                  if (phVar9->fs_ref[uVar44]->is_reference != 0) {
                    lVar42 = (long)iVar48;
                    iVar48 = iVar48 + 1;
                    ppHVar35[lVar42] = phVar9->fs_ref[uVar44];
                  }
                  uVar44 = uVar44 + 1;
                } while (uVar39 != uVar44);
              }
              qsort(ppHVar35,(long)iVar48,8,compare_fs_by_frame_num_desc);
              currSlice->listXsizeP[0] = '\0';
              gen_pic_list_from_frame_list
                        (currSlice->structure,ppHVar35,iVar48,currSlice->listP[0],
                         currSlice->listXsizeP,0);
              uVar39 = phVar9->ltref_frames_in_buffer;
              uVar44 = (ulong)uVar39;
              sVar75 = 0;
              if (uVar44 != 0) {
                uVar60 = 0;
                do {
                  ppHVar36[uVar60] = phVar9->fs_ltref[uVar60];
                  uVar60 = uVar60 + 1;
                  sVar75 = uVar44;
                } while (uVar44 != uVar60);
              }
              qsort(ppHVar36,sVar75,8,compare_fs_by_lt_pic_idx_asc);
              gen_pic_list_from_frame_list
                        (currSlice->structure,ppHVar36,uVar39,currSlice->listP[0],
                         currSlice->listXsizeP,1);
              mpp_osal_free("init_lists_p_slice_mvc",ppHVar35);
              mpp_osal_free("init_lists_p_slice_mvc",ppHVar36);
              goto LAB_00198b2c;
            }
            if ((h264d_debug & 1) != 0) {
              _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x468);
            }
            if (ppHVar35 != (H264_FrameStore_t **)0x0) {
              mpp_osal_free("init_lists_p_slice_mvc",ppHVar35);
            }
            if (ppHVar36 != (H264_FrameStore_t **)0x0) {
              mpp_osal_free("init_lists_p_slice_mvc",ppHVar36);
            }
            MVar33 = MPP_ERR_MALLOC;
            goto LAB_001989f4;
          }
LAB_00199369:
          phVar9 = currSlice->p_Dpb;
          phVar16 = currSlice->p_Dec;
          lVar42 = 0;
          do {
            phVar54 = phVar16->dpb_info;
            *(undefined8 *)((long)&phVar54->refpic + lVar42) = 0;
            *(undefined4 *)((long)&phVar54->BOT_POC + lVar42) = 0;
            *(undefined8 *)((long)&phVar54->field_flag + lVar42) = 0;
            *(undefined8 *)((long)&phVar54->slot_index + lVar42) = 0xffffffff;
            (&phVar54->colmv_is_used)[lVar42] = '\0';
            *(undefined2 *)((long)&phVar54->frame_num + lVar42) = 0;
            *(undefined1 (*) [16])((long)&phVar54->long_term_pic_num + lVar42) =
                 (undefined1  [16])0x0;
            lVar42 = lVar42 + 0x50;
          } while (lVar42 != 0x500);
          uVar39 = phVar9->ref_frames_in_buffer;
          uVar44 = (ulong)uVar39;
          if (uVar44 != 0) {
            pphVar37 = phVar9->fs_ref;
            phVar54 = phVar16->dpb_info;
            uVar60 = 0;
            do {
              phVar70 = pphVar37[uVar60];
              uVar56 = phVar70->is_used;
              if (uVar56 != 0) {
                if (uVar56 == 3) {
                  phVar54->refpic = phVar70->frame;
                  phVar70 = pphVar37[uVar60];
                  phVar34 = phVar70->frame;
                  iVar48 = phVar34->iCodingType;
                  if (iVar48 == 1) {
                    phVar54->TOP_POC = phVar70->top_field->poc;
                    iVar53 = phVar70->bottom_field->poc;
                  }
                  else {
                    iVar53 = phVar34->frame_poc;
                    if (iVar53 == phVar34->poc) {
                      phVar54->TOP_POC = phVar34->top_poc;
                      iVar53 = phVar34->bottom_poc;
                    }
                    else {
                      phVar54->TOP_POC = phVar34->top_poc - iVar53;
                      iVar53 = phVar34->bottom_poc - iVar53;
                    }
                  }
                  phVar54->BOT_POC = iVar53;
                  phVar54->field_flag = (uint)(iVar48 == 1);
                }
                else {
                  if ((uVar56 & 1) == 0) {
                    phVar54->refpic = phVar70->bottom_field;
                    phVar54->TOP_POC = 0;
                    phVar70 = pphVar37[uVar60];
                    phVar34 = phVar70->bottom_field;
                    phVar54->BOT_POC = phVar34->poc;
                  }
                  else {
                    phVar54->refpic = phVar70->top_field;
                    phVar70 = pphVar37[uVar60];
                    phVar34 = phVar70->top_field;
                    phVar54->TOP_POC = phVar34->poc;
                    phVar54->BOT_POC = 0;
                  }
                  phVar54->field_flag = 1;
                }
                phVar54->slot_index = phVar34->mem_mark->slot_idx;
                phVar54->colmv_is_used = phVar34->colmv_no_used_flag == '\0';
                uVar56 = phVar70->is_used;
              }
              phVar54->frame_num = (RK_U16)phVar70->frame_num;
              phVar54->is_long_term = 0;
              phVar54->long_term_frame_idx = 0;
              phVar54->long_term_pic_num = 0;
              phVar54->voidx = phVar70->layer_id;
              phVar54->view_id = phVar70->view_id;
              phVar54->is_used = uVar56;
              uVar60 = uVar60 + 1;
              phVar54 = phVar54 + 1;
            } while (uVar44 != uVar60);
          }
          uVar56 = phVar9->ltref_frames_in_buffer;
          if ((ulong)uVar56 != 0) {
            pphVar37 = phVar9->fs_ltref;
            phVar54 = phVar16->dpb_info;
            uVar60 = 0;
            do {
              uVar49 = uVar44 + uVar60;
              phVar70 = pphVar37[uVar60];
              uVar57 = phVar70->is_used;
              if (uVar57 == 3) {
                uVar71 = uVar49 & 0xffffffff;
                phVar54[uVar71].refpic = phVar70->frame;
                phVar70 = pphVar37[uVar60];
                phVar34 = phVar70->frame;
                iVar48 = phVar34->iCodingType;
                if (iVar48 == 1) {
                  phVar54[uVar71].TOP_POC = phVar70->top_field->poc;
                  RVar76 = phVar70->bottom_field->poc;
                }
                else {
                  iVar53 = phVar34->frame_poc;
                  if (iVar53 == phVar34->poc) {
                    phVar54[uVar71].TOP_POC = phVar34->top_poc;
                    RVar76 = phVar34->bottom_poc;
                  }
                  else {
                    phVar54[uVar71].TOP_POC = phVar34->top_poc - iVar53;
                    RVar76 = phVar34->bottom_poc - iVar53;
                  }
                }
                phVar54[uVar71].BOT_POC = RVar76;
                phVar54[uVar71].field_flag = (uint)(iVar48 == 1);
                phVar54[uVar71].slot_index = phVar34->mem_mark->slot_idx;
                phVar54[uVar71].colmv_is_used = phVar34->colmv_no_used_flag == '\0';
                RVar30 = phVar34->long_term_pic_num;
LAB_00199640:
                phVar54[uVar49 & 0xffffffff].long_term_pic_num = RVar30;
              }
              else {
                uVar71 = uVar49 & 0xffffffff;
                if (uVar57 != 0) {
                  if ((uVar57 & 1) == 0) {
                    phVar54[uVar71].refpic = phVar70->bottom_field;
                    phVar54[uVar71].TOP_POC = 0;
                    phVar70 = pphVar37[uVar60];
                    phVar34 = phVar70->bottom_field;
                    phVar54[uVar71].BOT_POC = phVar34->poc;
                  }
                  else {
                    phVar54[uVar71].refpic = phVar70->top_field;
                    phVar70 = pphVar37[uVar60];
                    phVar34 = phVar70->top_field;
                    phVar54[uVar71].TOP_POC = phVar34->poc;
                    phVar54[uVar71].BOT_POC = 0;
                  }
                  phVar54[uVar71].field_flag = 1;
                  phVar54[uVar71].slot_index = phVar34->mem_mark->slot_idx;
                  phVar54[uVar71].colmv_is_used = phVar34->colmv_no_used_flag == '\0';
                  RVar30 = phVar34->long_term_pic_num;
                  goto LAB_00199640;
                }
              }
              uVar49 = uVar49 & 0xffffffff;
              RVar30 = phVar70->long_term_frame_idx;
              phVar54[uVar49].frame_num = (RK_U16)RVar30;
              phVar54[uVar49].is_long_term = 1;
              phVar54[uVar49].long_term_frame_idx = RVar30;
              phVar54[uVar49].voidx = phVar70->layer_id;
              phVar54[uVar49].view_id = phVar70->view_id;
              phVar54[uVar49].is_used = phVar70->is_used;
              uVar60 = uVar60 + 1;
            } while (uVar56 != uVar60);
            uVar39 = uVar39 + (int)uVar60;
          }
          uVar56 = phVar9->used_size_il;
          if ((ulong)uVar56 != 0) {
            iVar48 = currSlice->structure;
            pphVar37 = phVar9->fs_ilref;
            uVar44 = 0;
            do {
              uVar60 = uVar39 + uVar44;
              phVar70 = pphVar37[uVar44];
              uVar57 = phVar70->is_used;
              if (iVar48 == 3) {
                if (uVar57 == 3) {
                  if ((phVar70->inter_view_flag[0] == 0) && (phVar70->inter_view_flag[1] == 0))
                  break;
                  phVar54 = phVar16->dpb_info;
                  uVar49 = uVar60 & 0xffffffff;
                  phVar54[uVar49].refpic = phVar70->frame;
                  phVar70 = pphVar37[uVar44];
                  phVar34 = phVar70->frame;
                  pRVar64 = &phVar34->top_poc;
                  pRVar68 = &phVar34->bottom_poc;
                  if (phVar34->is_mmco_5 != '\0') {
                    pRVar68 = &phVar34->bot_poc_mmco5;
                    pRVar64 = &phVar34->top_poc_mmco5;
                  }
                  RVar76 = *pRVar68;
                  phVar54[uVar49].TOP_POC = *pRVar64;
                  phVar54[uVar49].BOT_POC = RVar76;
                  phVar54[uVar49].field_flag = (uint)(phVar34->iCodingType == 1);
                  phVar54[uVar49].slot_index = phVar34->mem_mark->slot_idx;
                  RVar5 = phVar34->colmv_no_used_flag;
LAB_001998f7:
                  phVar54[uVar60 & 0xffffffff].colmv_is_used = RVar5 == '\0';
                }
              }
              else if (uVar57 != 0) {
                if (uVar57 == 3) {
                  if (phVar70->inter_view_flag[iVar48 == 2] == 0) break;
                  phVar54 = phVar16->dpb_info;
                  uVar49 = uVar60 & 0xffffffff;
                  phVar54[uVar49].refpic = phVar70->top_field;
                  phVar70 = pphVar37[uVar44];
                  phVar34 = phVar70->top_field;
                  pRVar64 = &phVar34->top_poc_mmco5;
                  if (phVar34->is_mmco_5 == '\0') {
                    pRVar64 = &phVar34->top_poc;
                  }
                  phVar54[uVar49].TOP_POC = *pRVar64;
                  phVar34 = phVar70->bottom_field;
                  pRVar64 = &phVar34->bot_poc_mmco5;
                  if (phVar34->is_mmco_5 == '\0') {
                    pRVar64 = &phVar34->bottom_poc;
                  }
                  phVar54[uVar49].BOT_POC = *pRVar64;
                  phVar34 = phVar70->frame;
                  phVar54[uVar49].field_flag = (uint)(phVar34->iCodingType == 1);
                  phVar54[uVar49].slot_index = phVar34->mem_mark->slot_idx;
                  phVar54[uVar49].colmv_is_used = phVar34->colmv_no_used_flag == '\0';
                  uVar57 = phVar70->is_used;
                }
                if ((uVar57 & 1) == 0) {
                  if (phVar70->inter_view_flag[1] == 0) break;
                  phVar54 = phVar16->dpb_info;
                  uVar49 = uVar60 & 0xffffffff;
                  phVar54[uVar49].refpic = phVar70->bottom_field;
                  phVar54[uVar49].TOP_POC = 0;
                  phVar70 = pphVar37[uVar44];
                  phVar34 = phVar70->bottom_field;
                  pRVar64 = &phVar34->bot_poc_mmco5;
                  if (phVar34->is_mmco_5 == '\0') {
                    pRVar64 = &phVar34->bottom_poc;
                  }
                  phVar54[uVar49].BOT_POC = *pRVar64;
                }
                else {
                  if (phVar70->inter_view_flag[0] == 0) break;
                  phVar54 = phVar16->dpb_info;
                  uVar49 = uVar60 & 0xffffffff;
                  phVar54[uVar49].refpic = phVar70->top_field;
                  phVar70 = pphVar37[uVar44];
                  phVar34 = phVar70->top_field;
                  pRVar64 = &phVar34->top_poc_mmco5;
                  if (phVar34->is_mmco_5 == '\0') {
                    pRVar64 = &phVar34->top_poc;
                  }
                  phVar54[uVar49].TOP_POC = *pRVar64;
                  phVar54[uVar49].BOT_POC = 0;
                }
                phVar54[uVar60 & 0xffffffff].field_flag = 1;
                phVar54[uVar60 & 0xffffffff].slot_index = phVar34->mem_mark->slot_idx;
                RVar5 = phVar34->colmv_no_used_flag;
                goto LAB_001998f7;
              }
              phVar54 = phVar16->dpb_info;
              uVar60 = uVar60 & 0xffffffff;
              phVar54[uVar60].frame_num = (RK_U16)phVar70->frame_num;
              phVar27 = phVar54 + uVar60;
              phVar27->is_long_term = 0;
              phVar27->is_ilt_flag = 1;
              *(undefined8 *)(&phVar27->is_long_term + 2) = 0;
              phVar54[uVar60].voidx = phVar70->layer_id;
              phVar54[uVar60].view_id = phVar70->view_id;
              phVar54[uVar60].is_used = phVar70->is_used;
              uVar44 = uVar44 + 1;
            } while (uVar56 != uVar44);
          }
          phVar16 = currSlice->p_Dec;
          memset(phVar16->refpic_info_p,0,0x180);
          memset(phVar16->refpic_info_b[0],0,0x180);
          memset(phVar16->refpic_info_b[1],0,0x180);
          if ((currSlice->idr_flag == 0) || (currSlice->layer_id != 0)) {
            uVar44 = 0;
            RVar76 = 0;
            do {
              if (currSlice->listXsizeP[0] <= uVar44) break;
              phVar34 = currSlice->listP[0][uVar44];
              if (phVar34->is_mmco_5 == '\0') {
                bVar77 = false;
              }
              else {
                bVar77 = phVar34->layer_id == 0 && currSlice->layer_id != 0;
              }
              iVar48 = phVar34->structure;
              if (iVar48 == 1) {
                lVar42 = 8;
                if (bVar77) {
                  lVar42 = 200;
                }
              }
              else if (iVar48 == 3) {
                lVar42 = 4;
                if (bVar77) {
                  lVar42 = 0xc4;
                }
              }
              else {
                lVar42 = 0xc;
                if (bVar77) {
                  lVar42 = 0xcc;
                }
              }
              iVar53 = *(int *)((long)&phVar34->structure + lVar42);
              pRVar64 = &phVar16->dpb_info->TOP_POC;
              lVar42 = 0;
              do {
                iVar58 = *pRVar64;
                iVar47 = pRVar64[1];
                uVar39 = pRVar64[10];
                if ((currSlice->structure == 3) &&
                   (*(h264_store_pic_t **)(pRVar64 + 0xe) != (h264_store_pic_t *)0x0)) {
                  iVar52 = iVar47;
                  if (iVar58 < iVar47) {
                    iVar52 = iVar58;
                  }
joined_r0x00199a84:
                  if (iVar53 == iVar52) {
LAB_00199a86:
                    if (phVar34->layer_id == pRVar64[8]) {
                      phVar45 = phVar16->refpic_info_p;
                      RVar76 = (RK_S32)lVar42;
                      phVar45[uVar44].dpb_idx = RVar76;
                      goto LAB_00199b4b;
                    }
                  }
                }
                else if (uVar39 == 3) {
                  if (iVar53 == iVar58 || iVar53 == iVar47) goto LAB_00199a86;
                }
                else {
                  iVar52 = iVar58;
                  if (((uVar39 & 1) != 0) || (iVar52 = iVar47, (uVar39 & 2) != 0))
                  goto joined_r0x00199a84;
                }
                lVar42 = lVar42 + 1;
                pRVar64 = pRVar64 + 0x14;
              } while (lVar42 != 0x10);
              if (((h264d_debug & 2) != 0) && (RVar76 < 0)) {
                _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "near_dpb_idx >= 0","prepare_init_ref_info",0x728);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0019a801;
                iVar48 = currSlice->listP[0][uVar44]->structure;
              }
              phVar45 = phVar16->refpic_info_p;
              phVar45[uVar44].dpb_idx = RVar76;
              pRVar2 = &(phVar16->errctx).cur_err_flag;
              *(byte *)pRVar2 = (byte)*pRVar2 | 1;
LAB_00199b4b:
              phVar45[uVar44].bottom_flag = (uint)(iVar48 == 2);
              phVar45[uVar44].valid = 1;
              uVar44 = uVar44 + 1;
            } while (uVar44 != 0x20);
            lVar42 = 0;
            bVar77 = true;
            do {
              bVar72 = bVar77;
              local_48 = (undefined1  [16])0x0;
              local_58 = (undefined1  [16])0x0;
              local_68 = (undefined1  [16])0x0;
              local_78 = (undefined1  [16])0x0;
              uVar44 = 0;
              uVar60 = 0;
              do {
                if (currSlice->listXsizeB[lVar42] <= uVar44) break;
                phVar34 = currSlice->listB[lVar42][uVar44];
                RVar30 = phVar34->layer_id;
                if (phVar34->is_mmco_5 == '\0') {
                  bVar77 = false;
                }
                else {
                  bVar77 = RVar30 == 0 && currSlice->layer_id != 0;
                }
                iVar48 = phVar34->structure;
                if (iVar48 == 1) {
                  lVar61 = 8;
                  lVar63 = 200;
                }
                else if (iVar48 == 3) {
                  lVar61 = 4;
                  lVar63 = 0xc4;
                }
                else {
                  lVar61 = 0xc;
                  lVar63 = 0xcc;
                }
                if (bVar77) {
                  lVar61 = lVar63;
                }
                iVar53 = *(int *)((long)&phVar34->structure + lVar61);
                pRVar64 = &phVar16->dpb_info->TOP_POC;
                uVar49 = 0;
                do {
                  iVar58 = *pRVar64;
                  iVar47 = pRVar64[1];
                  RVar32 = pRVar64[8];
                  uVar39 = pRVar64[10];
                  if ((currSlice->structure == 3) &&
                     (*(h264_store_pic_t **)(pRVar64 + 0xe) != (h264_store_pic_t *)0x0)) {
                    if (iVar58 < iVar47) {
                      iVar47 = iVar58;
                    }
                    if (((iVar53 == iVar47) && (RVar30 == RVar32)) &&
                       (*(int *)(local_78 + uVar49 * 4) == 0)) {
                      *(undefined4 *)(local_78 + uVar49 * 4) = 1;
                      goto LAB_00199d63;
                    }
                  }
                  else if (uVar39 == 3) {
                    if ((iVar53 == iVar58 || iVar53 == iVar47) && (RVar30 == RVar32))
                    goto LAB_00199d63;
                  }
                  else if ((uVar39 & 1) == 0) {
                    if (((uVar39 & 2) != 0) &&
                       ((iVar53 == iVar47 &&
                        ((RVar30 == RVar32 || (currSlice->bottom_field_flag != 0)))))) {
LAB_00199d63:
                      phVar45 = phVar16->refpic_info_b[lVar42];
                      phVar45[uVar44].dpb_idx = (RK_S32)uVar49;
                      uVar60 = uVar49 & 0xffffffff;
                      goto LAB_00199d92;
                    }
                  }
                  else if ((iVar53 == iVar58) &&
                          ((RVar30 == RVar32 || (currSlice->bottom_field_flag == 0))))
                  goto LAB_00199d63;
                  uVar49 = uVar49 + 1;
                  pRVar64 = pRVar64 + 0x14;
                } while (uVar49 != 0x10);
                if (((h264d_debug & 2) != 0) && ((int)uVar60 < 0)) {
                  _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "near_dpb_idx >= 0","prepare_init_ref_info",0x767);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0019a801;
                  iVar48 = currSlice->listB[lVar42][uVar44]->structure;
                }
                phVar45 = phVar16->refpic_info_b[lVar42];
                phVar45[uVar44].dpb_idx = (int)uVar60;
                pRVar2 = &(phVar16->errctx).cur_err_flag;
                *(byte *)pRVar2 = (byte)*pRVar2 | 1;
LAB_00199d92:
                phVar45[uVar44].bottom_flag = (uint)(iVar48 == 2);
                phVar45[uVar44].valid = 1;
                uVar44 = uVar44 + 1;
              } while (uVar44 != 0x20);
              lVar42 = 1;
              bVar77 = false;
            } while (bVar72);
          }
          phVar16 = currSlice->p_Dec;
          lVar42 = 4;
          lVar61 = 0;
          do {
            phVar54 = phVar16->dpb_info;
            if (*(long *)(&phVar54->field_0x3c + lVar42) == 0) {
              pHVar46 = phVar16->in_task;
LAB_00199e2d:
              pHVar46->refer[lVar61] = -1;
            }
            else {
              pHVar46 = phVar16->in_task;
              if (*(int *)(&phVar54->colmv_is_used + lVar42) < 0) goto LAB_00199e2d;
              pHVar46->refer[lVar61] = *(int *)(&phVar54->colmv_is_used + lVar42);
              mpp_buf_slot_set_flag
                        (phVar16->frame_slots,*(RK_S32 *)(&phVar54->colmv_is_used + lVar42),
                         SLOT_HAL_INPUT);
              mpp_buf_slot_set_flag
                        (phVar16->frame_slots,
                         *(RK_S32 *)(&phVar16->dpb_info->colmv_is_used + lVar42),SLOT_CODEC_USE);
            }
            lVar61 = lVar61 + 1;
            lVar42 = lVar42 + 0x50;
          } while (lVar61 != 0x10);
          if ((h264d_debug & 0x100) != 0) {
            _mpp_log_l(4,"h264d_init","[DPB_INFO] cur_slot_idx=%d",(char *)0x0,
                       (ulong)(uint)phVar16->in_task->output);
            uVar44 = 0;
            do {
              if ((-1 < phVar16->in_task->refer[uVar44]) && ((h264d_debug & 0x100) != 0)) {
                _mpp_log_l(4,"h264d_init","[DPB_INFO] ref_slot_idx[%d]=%d",(char *)0x0,
                           uVar44 & 0xffffffff);
              }
              uVar44 = uVar44 + 1;
            } while (uVar44 != 0x10);
          }
          lVar42 = 0;
          uVar39 = 0;
          do {
            phVar13 = phVar16->dpb_mark;
            if ((((&phVar13->out_flag)[lVar42] != '\0') &&
                (iVar48 = *(int *)((long)&phVar13->slot_idx + lVar42), -1 < iVar48)) &&
               (uVar39 = uVar39 + 1, (h264d_debug & 0x100) != 0)) {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = local_78._8_8_;
              local_78 = auVar26 << 0x40;
              mpp_buf_slot_get_prop(phVar16->frame_slots,iVar48,SLOT_FRAME_PTR,local_78);
              uVar44 = 0xff;
              if (((MppFrame)local_78._0_8_ != (MppFrame)0x0) &&
                 (buffer = mpp_frame_get_buffer((MppFrame)local_78._0_8_), buffer != (MppBuffer)0x0)
                 ) {
                uVar56 = mpp_buffer_get_fd_with_caller(buffer,"check_refer_dpb_buf_slots");
                uVar44 = (ulong)uVar56;
              }
              if ((h264d_debug & 0x100) != 0) {
                lVar61 = *(long *)((long)&phVar13->pic + lVar42);
                _mpp_log_l(4,"h264d_init",
                           "[DPB_MARK_INFO] slot_idx=%d, top_used=%d, bot_used=%d, out_flag=%d, fd=0x%02x, poc=%d, view_id=%d"
                           ,(char *)0x0,(ulong)*(uint *)((long)&phVar13->slot_idx + lVar42),
                           (ulong)(&phVar13->top_used)[lVar42],(ulong)(&phVar13->bot_used)[lVar42],
                           (ulong)(&phVar13->out_flag)[lVar42],uVar44,(ulong)*(uint *)(lVar61 + 4),
                           (ulong)*(uint *)(lVar61 + 0xbc));
              }
            }
            lVar42 = lVar42 + 0x20;
          } while (lVar42 != 0x460);
          if ((h264d_debug & 0x100) != 0) {
            _mpp_log_l(4,"h264d_init","[DPB_MARK_INFO] ---------- cur_slot=%d --------------------",
                       (char *)0x0,(ulong)(uint)phVar16->in_task->output);
          }
          RVar30 = phVar16->p_Vid->dpb_size[0];
          RVar32 = phVar16->p_Vid->dpb_size[1];
          uVar56 = 0x12;
          if (RVar32 + RVar30 < 0x11) {
            uVar56 = RVar32 + 2 + RVar30;
          }
          if (uVar39 <= uVar56) {
            pHVar15 = currSlice->p_Dec;
            if (currSlice->slice_type == 2) {
              (pHVar15->errctx).dpb_err_flag = 0;
            }
            else {
              iVar48 = currSlice->slice_type % 5;
              if ((iVar48 != 2) && (iVar48 != 4)) {
                if (currSlice->ref_pic_list_reordering_flag[0] == 0) {
                  uVar57 = currSlice->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
                  uVar39 = currSlice->num_ref_idx_override_flag;
                  uVar56 = uVar57;
                  if (uVar39 != 0) {
                    uVar56 = currSlice->num_ref_idx_active[0];
                  }
                  RVar30 = check_ref_dbp_err(pHVar15,pHVar15->refpic_info_b
                                                     [(ulong)(iVar48 == 1) - 1],uVar56);
                  uVar66 = (uint)(RVar30 != 0) | (pHVar15->errctx).cur_err_flag;
                  (pHVar15->errctx).cur_err_flag = uVar66;
                  if ((h264d_debug & 0x1000) != 0) {
                    _mpp_log_l(4,"h264d_init",
                               "list0 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l0=%d\n"
                               ,(char *)0x0,(ulong)uVar66,(ulong)uVar57,(ulong)uVar39,(ulong)uVar56)
                    ;
                  }
                }
                else {
                  RVar30 = check_ref_pic_list(currSlice,0);
                  pRVar2 = &(pHVar15->errctx).cur_err_flag;
                  *pRVar2 = *pRVar2 | RVar30;
                }
              }
              if (currSlice->slice_type % 5 == 1) {
                if (currSlice->ref_pic_list_reordering_flag[1] == 0) {
                  uVar57 = currSlice->active_pps->num_ref_idx_l1_default_active_minus1 + 1;
                  uVar39 = currSlice->num_ref_idx_override_flag;
                  uVar56 = uVar57;
                  if (uVar39 != 0) {
                    uVar56 = currSlice->num_ref_idx_active[1];
                  }
                  RVar30 = check_ref_dbp_err(pHVar15,pHVar15->refpic_info_b[1],uVar56);
                  uVar66 = (uint)(RVar30 != 0) | (pHVar15->errctx).cur_err_flag;
                  (pHVar15->errctx).cur_err_flag = uVar66;
                  if ((h264d_debug & 0x1000) != 0) {
                    _mpp_log_l(4,"h264d_init",
                               "list1 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l1=%d\n"
                               ,(char *)0x0,(ulong)uVar66,(ulong)uVar57,(ulong)uVar39,(ulong)uVar56)
                    ;
                  }
                }
                else {
                  RVar30 = check_ref_pic_list(currSlice,1);
                  pRVar2 = &(pHVar15->errctx).cur_err_flag;
                  *pRVar2 = *pRVar2 | RVar30;
                }
              }
            }
            phVar24 = phVar7->dxva_ctx;
            fill_picparams(currSlice->p_Vid,&phVar24->pp);
            if ((phVar24->pp).scaleing_list_enable_flag != '\0') {
              prepare_init_scanlist(currSlice);
              fill_scanlist(currSlice->p_Vid,&phVar24->qm);
            }
            return MPP_OK;
          }
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_init","[h264d_reset_error]",(char *)0x0);
          }
          h264d_reset(phVar16);
          MVar33 = MPP_NOK;
          if ((h264d_debug & 4) == 0) {
            return MPP_NOK;
          }
          uVar67 = 0x838;
        }
        goto LAB_00198265;
      }
    }
    else {
      if (iVar53 == 1) {
        if (currSlice->idr_flag == 0) {
          if (p_Vid->last_has_mmco_5 == 0) {
            RVar32 = p_Vid->PreviousFrameNum;
            RVar30 = p_Vid->PreviousFrameNumOffset;
          }
          else {
            RVar30 = 0;
            p_Vid->PreviousFrameNumOffset = 0;
            p_Vid->PreviousFrameNum = 0;
            RVar32 = 0;
          }
          RVar40 = currSlice->frame_num;
          if ((int)RVar40 < (int)RVar32) {
            RVar30 = RVar30 + p_Vid->max_frame_num;
          }
          p_Vid->FrameNumOffset = RVar30;
        }
        else {
          p_Vid->FrameNumOffset = 0;
          if (currSlice->frame_num != 0) {
            uVar67 = 0x62;
            goto LAB_00196e8b;
          }
          RVar40 = 0;
          RVar30 = 0;
        }
        uVar39 = phVar10->num_ref_frames_in_pic_order_cnt_cycle;
        uVar44 = (ulong)uVar39;
        if (uVar44 == 0) {
          currSlice->AbsFrameNum = 0;
          iVar53 = 0;
          iVar58 = currSlice->nal_reference_idc;
          p_Vid->ExpectedDeltaPerPicOrderCntCycle = 0;
          p_Vid->ExpectedPicOrderCnt = 0;
        }
        else {
          RVar32 = RVar30 + RVar40;
          currSlice->AbsFrameNum = RVar32;
          iVar58 = currSlice->nal_reference_idc;
          if (iVar58 == 0) {
            if (RVar32 == 0) {
              RVar32 = 0;
            }
            else {
              RVar32 = RVar32 - 1;
              currSlice->AbsFrameNum = RVar32;
            }
          }
          p_Vid->ExpectedDeltaPerPicOrderCntCycle = 0;
          if ((int)uVar39 < 1) {
            iVar53 = 0;
          }
          else {
            uVar60 = 0;
            iVar53 = 0;
            do {
              iVar53 = iVar53 + phVar10->offset_for_ref_frame[uVar60];
              p_Vid->ExpectedDeltaPerPicOrderCntCycle = iVar53;
              uVar60 = uVar60 + 1;
            } while (uVar44 != uVar60);
          }
          if (RVar32 == 0) {
            iVar53 = 0;
            p_Vid->ExpectedPicOrderCnt = 0;
          }
          else {
            uVar39 = (RVar32 - 1) / uVar39;
            uVar44 = (ulong)(RVar32 - 1) % uVar44;
            p_Vid->PicOrderCntCycleCnt = uVar39;
            iVar47 = (int)uVar44;
            p_Vid->FrameNumInPicOrderCntCycle = iVar47;
            iVar53 = iVar53 * uVar39;
            p_Vid->ExpectedPicOrderCnt = iVar53;
            if (-1 < iVar47) {
              uVar60 = 0xffffffffffffffff;
              do {
                iVar53 = iVar53 + phVar10->offset_for_ref_frame[uVar60 + 1];
                p_Vid->ExpectedPicOrderCnt = iVar53;
                uVar60 = uVar60 + 1;
              } while (uVar60 < uVar44);
            }
          }
        }
        if (iVar58 == 0) {
          iVar53 = iVar53 + phVar10->offset_for_non_ref_pic;
          p_Vid->ExpectedPicOrderCnt = iVar53;
        }
        if (currSlice->field_pic_flag == 0) {
          RVar76 = iVar53 + currSlice->delta_pic_order_cnt[0];
          currSlice->toppoc = RVar76;
          RVar62 = phVar10->offset_for_top_to_bottom_field + RVar76 +
                   currSlice->delta_pic_order_cnt[1];
          currSlice->bottompoc = RVar62;
          iVar53 = RVar62;
          if (RVar76 < RVar62) {
            iVar53 = RVar76;
          }
        }
        else if (currSlice->bottom_field_flag == 0) {
          iVar53 = iVar53 + currSlice->delta_pic_order_cnt[0];
          currSlice->toppoc = iVar53;
          RVar76 = iVar53;
        }
        else {
          RVar62 = iVar53 + phVar10->offset_for_top_to_bottom_field +
                   currSlice->delta_pic_order_cnt[0];
          currSlice->bottompoc = RVar62;
          iVar53 = RVar62;
        }
        *pRVar1 = iVar53;
        *pRVar68 = iVar53;
        RVar31 = RVar76;
        goto LAB_001972e3;
      }
      MVar33 = MPP_NOK;
      if (iVar53 == 0) {
        if (currSlice->idr_flag == 0) {
          if (p_Vid->last_has_mmco_5 == 0) {
            RVar31 = p_Vid->PrevPicOrderCntLsb;
          }
          else {
            p_Vid->PrevPicOrderCntMsb = 0;
            if (p_Vid->last_pic_bottom_field != 0) {
              p_Vid->PrevPicOrderCntLsb = 0;
              goto LAB_00196d1f;
            }
            p_Vid->PrevPicOrderCntLsb = RVar76;
            RVar31 = RVar76;
          }
        }
        else {
          p_Vid->PrevPicOrderCntMsb = 0;
          p_Vid->PrevPicOrderCntLsb = 0;
LAB_00196d1f:
          RVar31 = 0;
        }
        iVar58 = currSlice->pic_order_cnt_lsb;
        if ((iVar58 < RVar31) && ((int)(uVar39 >> 1) <= RVar31 - iVar58)) {
          RVar30 = uVar39 + p_Vid->PrevPicOrderCntMsb;
        }
        else if ((RVar31 < iVar58) && ((int)(uVar39 >> 1) < iVar58 - RVar31)) {
          RVar30 = p_Vid->PrevPicOrderCntMsb - uVar39;
        }
        else {
          RVar30 = p_Vid->PrevPicOrderCntMsb;
        }
        currSlice->PicOrderCntMsb = RVar30;
        if (currSlice->field_pic_flag == 0) {
          RVar31 = RVar30 + iVar58;
          currSlice->toppoc = RVar31;
          RVar62 = currSlice->delta_pic_order_cnt_bottom + RVar31;
          currSlice->bottompoc = RVar62;
          iVar53 = RVar62;
          if (0 < currSlice->delta_pic_order_cnt_bottom) {
            iVar53 = RVar31;
          }
        }
        else {
          RVar31 = RVar30 + iVar58;
          iVar53 = RVar31;
          if (currSlice->bottom_field_flag == 0) {
            *local_c0 = RVar31;
          }
          else {
            *pRVar64 = RVar31;
            RVar62 = RVar31;
            RVar31 = RVar76;
          }
        }
        currSlice->ThisPOC = iVar53;
        currSlice->framepoc = iVar53;
        p_Vid->ThisPOC = iVar53;
        p_Vid->PreviousFrameNum = currSlice->frame_num;
        if (currSlice->nal_reference_idc != 0) {
          p_Vid->PrevPicOrderCntLsb = iVar58;
          lVar42 = 0xcb8;
          goto LAB_001972ee;
        }
        goto LAB_001972f2;
      }
LAB_00196eb8:
      if ((h264d_debug & 4) == 0) goto LAB_0019821d;
      uVar67 = 0x28f;
LAB_00196ee3:
      _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,uVar67);
    }
  }
LAB_0019821d:
  mpp_mem_pool_put_f("alloc_decpic",p_Vid->pic_st,phVar34);
  p_Vid->dec_pic = (h264_store_pic_t *)0x0;
  if ((h264d_debug & 4) == 0) {
    return MVar33;
  }
  uVar67 = 0x814;
LAB_00198265:
  _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,uVar67);
  return MVar33;
}

Assistant:

MPP_RET init_picture(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec   = currSlice->p_Vid->p_Dec;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dErrCtx_t *p_err   = &p_Dec->errctx;

    //!< discard stream before I_SLICE
    if (!p_err->i_slice_no && p_Vid->recovery.valid_flag && p_Vid->recovery.first_frm_valid &&
        p_Vid->recovery.first_frm_id == currSlice->frame_num) {
        p_err->i_slice_no += (!currSlice->layer_id) ? 1 : 0;
    } else {
        p_err->i_slice_no += ((!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ? 1 : 0;
    }

    if (!p_err->i_slice_no) {
        H264D_WARNNING("[Discard] Discard slice before I Slice. \n");
        ret = MPP_NOK;
        goto __FAILED;
    }
    FUN_CHECK(ret = alloc_decpic(currSlice));
    if (((p_err->i_slice_no < 2) && (!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ||
        currSlice->idr_flag) {
        p_err->first_iframe_poc = p_Vid->dec_pic->poc; //!< recoder first i frame poc
        p_err->first_iframe_is_output = 0;
    }
    //!< idr_memory_management MVC_layer, idr_flag==1
    if (currSlice->layer_id && !currSlice->svc_extension_flag && !currSlice->mvcExt.non_idr_flag) {
        ASSERT(currSlice->layer_id == 1);
        FUN_CHECK(ret = idr_memory_management(p_Vid->p_Dpb_layer[currSlice->layer_id], p_Vid->dec_pic));
    }

    // if cur pic i frame poc & frame_num <= last pic, flush dpb.
    if (p_Vid->last_pic != NULL && p_Vid->dec_pic->poc != 0) {
        if (p_Vid->last_pic->frame_num >= p_Vid->dec_pic->frame_num
            && p_Vid->last_pic->poc >= p_Vid->dec_pic->poc
            && p_Vid->dec_pic->slice_type == H264_I_SLICE
            && p_Vid->dec_pic->structure == 3) {
            if (currSlice->layer_id == 0) {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
            } else {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
            }
        }
    }
    update_ref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_ltref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_pic_num(currSlice);
    //!< reorder
    if (!currSlice->idr_flag || currSlice->layer_id) {
        FUN_CHECK(ret = init_lists_p_slice_mvc(currSlice));
        FUN_CHECK(ret = init_lists_b_slice_mvc(currSlice));
    }
    prepare_init_dpb_info(currSlice);
    prepare_init_ref_info(currSlice);

    FUN_CHECK(ret = check_refer_dpb_buf_slots(currSlice));
    check_refer_picture_lists(currSlice);
    {
        H264dDxvaCtx_t *dxva_ctx = p_Dec->dxva_ctx;

        fill_picparams(currSlice->p_Vid, &dxva_ctx->pp);
        if (dxva_ctx->pp.scaleing_list_enable_flag) {
            prepare_init_scanlist(currSlice);
            fill_scanlist(currSlice->p_Vid, &dxva_ctx->qm);
        }
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}